

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

void embree::avx512::CurveNiMBIntersector1<4>::
     intersect_t<embree::avx512::SweepCurve1Intersector1<embree::BezierCurveT>,embree::avx512::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  Primitive PVar4;
  Geometry *pGVar5;
  __int_type_conflict _Var6;
  long lVar7;
  long lVar8;
  RTCFilterFunctionN p_Var9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  float fVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  int iVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [12];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  byte bVar58;
  byte bVar59;
  ulong uVar60;
  byte bVar61;
  byte bVar62;
  long lVar63;
  long lVar64;
  bool bVar65;
  ulong uVar66;
  uint uVar67;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  uint uVar120;
  uint uVar121;
  uint uVar123;
  uint uVar124;
  uint uVar125;
  undefined1 in_YmmResult [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  uint uVar122;
  uint uVar126;
  undefined1 auVar119 [32];
  float fVar127;
  vint4 bi_2;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar144 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 extraout_var [60];
  undefined1 auVar147 [64];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar148 [64];
  undefined1 auVar149 [64];
  vint4 bi_1;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  vint4 bi;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [32];
  undefined1 auVar195 [64];
  vint4 ai_2;
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [64];
  undefined4 uVar206;
  vint4 ai_1;
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  float fVar214;
  float fVar222;
  float fVar223;
  vint4 ai;
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  float fVar224;
  float fVar225;
  float fVar226;
  float fVar227;
  undefined1 auVar221 [32];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [64];
  undefined4 uVar239;
  undefined4 uVar240;
  float fVar241;
  undefined1 auVar238 [28];
  undefined1 auVar242 [32];
  undefined4 uVar244;
  undefined4 uVar245;
  undefined4 uVar246;
  undefined1 auVar243 [64];
  undefined1 auVar247 [32];
  undefined1 auVar248 [16];
  undefined1 auVar249 [64];
  undefined1 auVar250 [16];
  undefined1 in_ZMM31 [64];
  RTCFilterFunctionNArguments args;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  StackEntry stack [3];
  int local_88c;
  ulong local_888;
  undefined1 local_880 [32];
  ulong local_848;
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [16];
  undefined1 local_7f0 [16];
  ulong local_7d8;
  RTCFilterFunctionNArguments local_7d0;
  uint local_79c;
  uint local_798;
  undefined4 local_794;
  undefined1 local_790 [16];
  undefined8 local_780;
  float local_778;
  float local_774;
  undefined4 local_770;
  uint local_76c;
  uint local_768;
  uint local_764;
  uint local_760;
  ulong local_748;
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float fStack_6e4;
  undefined1 local_6e0 [32];
  undefined1 local_6b0 [16];
  undefined1 local_6a0 [16];
  float local_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined1 local_680 [16];
  undefined1 local_670 [16];
  undefined1 local_660 [16];
  undefined1 local_650 [16];
  undefined1 local_640 [16];
  Primitive *local_630;
  ulong local_628;
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined4 local_560;
  undefined4 uStack_55c;
  undefined4 uStack_558;
  undefined4 uStack_554;
  undefined4 uStack_550;
  undefined4 uStack_54c;
  undefined4 uStack_548;
  undefined4 uStack_544;
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  float local_500;
  float fStack_4fc;
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_490 [16];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [32];
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined4 local_2a0;
  undefined4 uStack_29c;
  undefined4 uStack_298;
  undefined4 uStack_294;
  undefined4 uStack_290;
  undefined4 uStack_28c;
  undefined4 uStack_288;
  undefined4 uStack_284;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  float local_220;
  float fStack_21c;
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined4 local_1a0;
  undefined4 uStack_19c;
  undefined4 uStack_198;
  undefined4 uStack_194;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  undefined4 uStack_188;
  undefined4 uStack_184;
  byte abStack_180 [32];
  undefined1 auStack_160 [32];
  float afStack_140 [2];
  uint auStack_138 [66];
  undefined1 auVar114 [32];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  
  PVar4 = prim[1];
  uVar60 = (ulong)(byte)PVar4;
  lVar64 = uVar60 * 0x25;
  fVar214 = *(float *)(prim + lVar64 + 0x12);
  auVar75 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                       *(undefined1 (*) [16])(prim + lVar64 + 6));
  auVar172._0_4_ = fVar214 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar172._4_4_ = fVar214 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar172._8_4_ = fVar214 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar172._12_4_ = fVar214 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar76 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 4 + 6)));
  auVar196._0_4_ = fVar214 * auVar75._0_4_;
  auVar196._4_4_ = fVar214 * auVar75._4_4_;
  auVar196._8_4_ = fVar214 * auVar75._8_4_;
  auVar196._12_4_ = fVar214 * auVar75._12_4_;
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar75 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 5 + 6)));
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar69 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 6 + 6)));
  auVar77 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 0xf + 6)));
  auVar69 = vcvtdq2ps_avx(auVar69);
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar78 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar4 * 0x10 + 6)));
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar70 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar4 * 0x10 + uVar60 + 6)));
  auVar70 = vcvtdq2ps_avx(auVar70);
  auVar79 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 0x1a + 6)));
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar80 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 0x1b + 6)));
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar71 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 0x1c + 6)));
  auVar71 = vcvtdq2ps_avx(auVar71);
  auVar207._4_4_ = auVar172._0_4_;
  auVar207._0_4_ = auVar172._0_4_;
  auVar207._8_4_ = auVar172._0_4_;
  auVar207._12_4_ = auVar172._0_4_;
  auVar81 = vshufps_avx(auVar172,auVar172,0x55);
  auVar82 = vshufps_avx(auVar172,auVar172,0xaa);
  fVar214 = auVar82._0_4_;
  auVar173._0_4_ = fVar214 * auVar69._0_4_;
  fVar222 = auVar82._4_4_;
  auVar173._4_4_ = fVar222 * auVar69._4_4_;
  fVar223 = auVar82._8_4_;
  auVar173._8_4_ = fVar223 * auVar69._8_4_;
  fVar224 = auVar82._12_4_;
  auVar173._12_4_ = fVar224 * auVar69._12_4_;
  auVar150._0_4_ = auVar70._0_4_ * fVar214;
  auVar150._4_4_ = auVar70._4_4_ * fVar222;
  auVar150._8_4_ = auVar70._8_4_ * fVar223;
  auVar150._12_4_ = auVar70._12_4_ * fVar224;
  auVar128._0_4_ = auVar71._0_4_ * fVar214;
  auVar128._4_4_ = auVar71._4_4_ * fVar222;
  auVar128._8_4_ = auVar71._8_4_ * fVar223;
  auVar128._12_4_ = auVar71._12_4_ * fVar224;
  auVar82 = vfmadd231ps_fma(auVar173,auVar81,auVar75);
  auVar23 = vfmadd231ps_fma(auVar150,auVar81,auVar78);
  auVar81 = vfmadd231ps_fma(auVar128,auVar80,auVar81);
  auVar82 = vfmadd231ps_fma(auVar82,auVar207,auVar76);
  auVar23 = vfmadd231ps_fma(auVar23,auVar207,auVar77);
  auVar24 = vfmadd231ps_fma(auVar81,auVar79,auVar207);
  auVar250._4_4_ = auVar196._0_4_;
  auVar250._0_4_ = auVar196._0_4_;
  auVar250._8_4_ = auVar196._0_4_;
  auVar250._12_4_ = auVar196._0_4_;
  auVar81 = vshufps_avx(auVar196,auVar196,0x55);
  auVar94._16_16_ = in_YmmResult._16_16_;
  auVar68 = vshufps_avx512vl(auVar196,auVar196,0xaa);
  auVar69 = vmulps_avx512vl(auVar68,auVar69);
  auVar70 = vmulps_avx512vl(auVar68,auVar70);
  auVar71 = vmulps_avx512vl(auVar68,auVar71);
  auVar75 = vfmadd231ps_fma(auVar69,auVar81,auVar75);
  auVar69 = vfmadd231ps_fma(auVar70,auVar81,auVar78);
  auVar78 = vfmadd231ps_fma(auVar71,auVar81,auVar80);
  auVar25 = vfmadd231ps_fma(auVar75,auVar250,auVar76);
  auVar128 = vfmadd231ps_fma(auVar69,auVar250,auVar77);
  auVar234._8_4_ = 0x7fffffff;
  auVar234._0_8_ = 0x7fffffff7fffffff;
  auVar234._12_4_ = 0x7fffffff;
  auVar129 = vfmadd231ps_fma(auVar78,auVar250,auVar79);
  auVar76 = vandps_avx(auVar234,auVar82);
  auVar228._8_4_ = 0x219392ef;
  auVar228._0_8_ = 0x219392ef219392ef;
  auVar228._12_4_ = 0x219392ef;
  uVar66 = vcmpps_avx512vl(auVar76,auVar228,1);
  bVar10 = (bool)((byte)uVar66 & 1);
  auVar72._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar82._0_4_;
  bVar10 = (bool)((byte)(uVar66 >> 1) & 1);
  auVar72._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar82._4_4_;
  bVar10 = (bool)((byte)(uVar66 >> 2) & 1);
  auVar72._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar82._8_4_;
  bVar10 = (bool)((byte)(uVar66 >> 3) & 1);
  auVar72._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar82._12_4_;
  auVar76 = vandps_avx(auVar234,auVar23);
  uVar66 = vcmpps_avx512vl(auVar76,auVar228,1);
  bVar10 = (bool)((byte)uVar66 & 1);
  auVar73._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar23._0_4_;
  bVar10 = (bool)((byte)(uVar66 >> 1) & 1);
  auVar73._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar23._4_4_;
  bVar10 = (bool)((byte)(uVar66 >> 2) & 1);
  auVar73._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar23._8_4_;
  bVar10 = (bool)((byte)(uVar66 >> 3) & 1);
  auVar73._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar23._12_4_;
  auVar76 = vandps_avx(auVar234,auVar24);
  uVar66 = vcmpps_avx512vl(auVar76,auVar228,1);
  bVar10 = (bool)((byte)uVar66 & 1);
  auVar74._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar24._0_4_;
  bVar10 = (bool)((byte)(uVar66 >> 1) & 1);
  auVar74._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar24._4_4_;
  bVar10 = (bool)((byte)(uVar66 >> 2) & 1);
  auVar74._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar24._8_4_;
  bVar10 = (bool)((byte)(uVar66 >> 3) & 1);
  auVar74._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar24._12_4_;
  auVar75 = vrcp14ps_avx512vl(auVar72);
  auVar229._8_4_ = 0x3f800000;
  auVar229._0_8_ = &DAT_3f8000003f800000;
  auVar229._12_4_ = 0x3f800000;
  auVar76 = vfnmadd213ps_fma(auVar72,auVar75,auVar229);
  auVar24 = vfmadd132ps_fma(auVar76,auVar75,auVar75);
  auVar75 = vrcp14ps_avx512vl(auVar73);
  auVar76 = vfnmadd213ps_fma(auVar73,auVar75,auVar229);
  auVar68 = vfmadd132ps_fma(auVar76,auVar75,auVar75);
  auVar75 = vrcp14ps_avx512vl(auVar74);
  auVar76 = vfnmadd213ps_fma(auVar74,auVar75,auVar229);
  auVar22 = vfmadd132ps_fma(auVar76,auVar75,auVar75);
  fVar214 = ((ray->super_RayK<1>).dir.field_0.m128[3] - *(float *)(prim + lVar64 + 0x16)) *
            *(float *)(prim + lVar64 + 0x1a);
  auVar215._4_4_ = fVar214;
  auVar215._0_4_ = fVar214;
  auVar215._8_4_ = fVar214;
  auVar215._12_4_ = fVar214;
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + uVar60 * 7 + 6);
  auVar76 = vpmovsxwd_avx(auVar76);
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + uVar60 * 0xb + 6);
  auVar75 = vpmovsxwd_avx(auVar75);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar77 = vsubps_avx(auVar75,auVar76);
  auVar69._8_8_ = 0;
  auVar69._0_8_ = *(ulong *)(prim + uVar60 * 9 + 6);
  auVar75 = vpmovsxwd_avx(auVar69);
  auVar69 = vfmadd213ps_fma(auVar77,auVar215,auVar76);
  auVar76 = vcvtdq2ps_avx(auVar75);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + uVar60 * 0xd + 6);
  auVar75 = vpmovsxwd_avx(auVar77);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar75 = vsubps_avx(auVar75,auVar76);
  auVar77 = vfmadd213ps_fma(auVar75,auVar215,auVar76);
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + uVar60 * 0x12 + 6);
  auVar76 = vpmovsxwd_avx(auVar78);
  auVar76 = vcvtdq2ps_avx(auVar76);
  uVar66 = (ulong)(uint)((int)(uVar60 * 5) << 2);
  auVar70._8_8_ = 0;
  auVar70._0_8_ = *(ulong *)(prim + uVar60 * 2 + uVar66 + 6);
  auVar75 = vpmovsxwd_avx(auVar70);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar75 = vsubps_avx(auVar75,auVar76);
  auVar78 = vfmadd213ps_fma(auVar75,auVar215,auVar76);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + uVar66 + 6);
  auVar76 = vpmovsxwd_avx(auVar79);
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + uVar60 * 0x18 + 6);
  auVar75 = vpmovsxwd_avx(auVar80);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar75 = vsubps_avx(auVar75,auVar76);
  auVar70 = vfmadd213ps_fma(auVar75,auVar215,auVar76);
  auVar71._8_8_ = 0;
  auVar71._0_8_ = *(ulong *)(prim + uVar60 * 0x1d + 6);
  auVar76 = vpmovsxwd_avx(auVar71);
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + uVar60 + (ulong)(byte)PVar4 * 0x20 + 6);
  auVar75 = vpmovsxwd_avx(auVar81);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar75 = vsubps_avx(auVar75,auVar76);
  auVar79 = vfmadd213ps_fma(auVar75,auVar215,auVar76);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar4 * 0x20 - uVar60) + 6);
  auVar76 = vpmovsxwd_avx(auVar82);
  auVar76 = vcvtdq2ps_avx(auVar76);
  local_630 = prim;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar60 * 0x23 + 6);
  auVar75 = vpmovsxwd_avx(auVar23);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar75 = vsubps_avx(auVar75,auVar76);
  auVar75 = vfmadd213ps_fma(auVar75,auVar215,auVar76);
  auVar76 = vsubps_avx(auVar69,auVar25);
  auVar216._0_4_ = auVar24._0_4_ * auVar76._0_4_;
  auVar216._4_4_ = auVar24._4_4_ * auVar76._4_4_;
  auVar216._8_4_ = auVar24._8_4_ * auVar76._8_4_;
  auVar216._12_4_ = auVar24._12_4_ * auVar76._12_4_;
  auVar76 = vsubps_avx(auVar77,auVar25);
  auVar174._0_4_ = auVar24._0_4_ * auVar76._0_4_;
  auVar174._4_4_ = auVar24._4_4_ * auVar76._4_4_;
  auVar174._8_4_ = auVar24._8_4_ * auVar76._8_4_;
  auVar174._12_4_ = auVar24._12_4_ * auVar76._12_4_;
  auVar76 = vsubps_avx(auVar78,auVar128);
  auVar208._0_4_ = auVar68._0_4_ * auVar76._0_4_;
  auVar208._4_4_ = auVar68._4_4_ * auVar76._4_4_;
  auVar208._8_4_ = auVar68._8_4_ * auVar76._8_4_;
  auVar208._12_4_ = auVar68._12_4_ * auVar76._12_4_;
  auVar76 = vsubps_avx(auVar70,auVar128);
  auVar151._0_4_ = auVar68._0_4_ * auVar76._0_4_;
  auVar151._4_4_ = auVar68._4_4_ * auVar76._4_4_;
  auVar151._8_4_ = auVar68._8_4_ * auVar76._8_4_;
  auVar151._12_4_ = auVar68._12_4_ * auVar76._12_4_;
  auVar76 = vsubps_avx(auVar79,auVar129);
  auVar197._0_4_ = auVar22._0_4_ * auVar76._0_4_;
  auVar197._4_4_ = auVar22._4_4_ * auVar76._4_4_;
  auVar197._8_4_ = auVar22._8_4_ * auVar76._8_4_;
  auVar197._12_4_ = auVar22._12_4_ * auVar76._12_4_;
  auVar76 = vsubps_avx(auVar75,auVar129);
  auVar129._0_4_ = auVar22._0_4_ * auVar76._0_4_;
  auVar129._4_4_ = auVar22._4_4_ * auVar76._4_4_;
  auVar129._8_4_ = auVar22._8_4_ * auVar76._8_4_;
  auVar129._12_4_ = auVar22._12_4_ * auVar76._12_4_;
  auVar76 = vpminsd_avx(auVar216,auVar174);
  auVar75 = vpminsd_avx(auVar208,auVar151);
  auVar76 = vmaxps_avx(auVar76,auVar75);
  auVar75 = vpminsd_avx(auVar197,auVar129);
  uVar206 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar24._4_4_ = uVar206;
  auVar24._0_4_ = uVar206;
  auVar24._8_4_ = uVar206;
  auVar24._12_4_ = uVar206;
  auVar75 = vmaxps_avx512vl(auVar75,auVar24);
  auVar76 = vmaxps_avx(auVar76,auVar75);
  auVar68._8_4_ = 0x3f7ffffa;
  auVar68._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar68._12_4_ = 0x3f7ffffa;
  local_490 = vmulps_avx512vl(auVar76,auVar68);
  auVar76 = vpmaxsd_avx(auVar216,auVar174);
  auVar75 = vpmaxsd_avx(auVar208,auVar151);
  auVar76 = vminps_avx(auVar76,auVar75);
  auVar75 = vpmaxsd_avx(auVar197,auVar129);
  fVar214 = (ray->super_RayK<1>).tfar;
  auVar22._4_4_ = fVar214;
  auVar22._0_4_ = fVar214;
  auVar22._8_4_ = fVar214;
  auVar22._12_4_ = fVar214;
  auVar75 = vminps_avx512vl(auVar75,auVar22);
  auVar76 = vminps_avx(auVar76,auVar75);
  auVar25._8_4_ = 0x3f800003;
  auVar25._0_8_ = 0x3f8000033f800003;
  auVar25._12_4_ = 0x3f800003;
  auVar76 = vmulps_avx512vl(auVar76,auVar25);
  auVar94._0_16_ = vpbroadcastd_avx512vl();
  uVar18 = vcmpps_avx512vl(local_490,auVar76,2);
  uVar66 = vpcmpgtd_avx512vl(auVar94._0_16_,_DAT_01ff0cf0);
  uVar66 = ((byte)uVar18 & 0xf) & uVar66;
  if ((char)uVar66 == '\0') {
    return;
  }
  auVar249 = ZEXT864(0) << 0x20;
  auVar243 = ZEXT3264(_DAT_02020f20);
LAB_01bf4eb4:
  local_628 = uVar66;
  lVar64 = 0;
  for (; (uVar66 & 1) == 0; uVar66 = uVar66 >> 1 | 0x8000000000000000) {
    lVar64 = lVar64 + 1;
  }
  local_888 = (ulong)*(uint *)(local_630 + 2);
  pGVar5 = (context->scene->geometries).items[*(uint *)(local_630 + 2)].ptr;
  local_848 = (ulong)*(uint *)(local_630 + lVar64 * 4 + 6);
  uVar66 = (ulong)*(uint *)(*(long *)&pGVar5->field_0x58 +
                           (ulong)*(uint *)(local_630 + lVar64 * 4 + 6) *
                           pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar214 = (pGVar5->time_range).lower;
  fVar214 = pGVar5->fnumTimeSegments *
            (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar214) /
            ((pGVar5->time_range).upper - fVar214));
  auVar76 = vroundss_avx(ZEXT416((uint)fVar214),ZEXT416((uint)fVar214),9);
  auVar76 = vminss_avx(auVar76,ZEXT416((uint)(pGVar5->fnumTimeSegments + -1.0)));
  auVar76 = vmaxss_avx(ZEXT816(0) << 0x20,auVar76);
  fVar214 = fVar214 - auVar76._0_4_;
  _Var6 = pGVar5[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar63 = (long)(int)auVar76._0_4_ * 0x38;
  lVar64 = *(long *)(_Var6 + 0x10 + lVar63);
  lVar7 = *(long *)(_Var6 + 0x38 + lVar63);
  lVar8 = *(long *)(_Var6 + 0x48 + lVar63);
  pfVar1 = (float *)(lVar7 + uVar66 * lVar8);
  auVar175._0_4_ = fVar214 * *pfVar1;
  auVar175._4_4_ = fVar214 * pfVar1[1];
  auVar175._8_4_ = fVar214 * pfVar1[2];
  auVar175._12_4_ = fVar214 * pfVar1[3];
  pfVar1 = (float *)(lVar7 + (uVar66 + 1) * lVar8);
  auVar191._0_4_ = fVar214 * *pfVar1;
  auVar191._4_4_ = fVar214 * pfVar1[1];
  auVar191._8_4_ = fVar214 * pfVar1[2];
  auVar191._12_4_ = fVar214 * pfVar1[3];
  pfVar1 = (float *)(lVar7 + (uVar66 + 2) * lVar8);
  auVar198._0_4_ = fVar214 * *pfVar1;
  auVar198._4_4_ = fVar214 * pfVar1[1];
  auVar198._8_4_ = fVar214 * pfVar1[2];
  auVar198._12_4_ = fVar214 * pfVar1[3];
  pfVar1 = (float *)(lVar7 + lVar8 * (uVar66 + 3));
  auVar152._0_4_ = fVar214 * *pfVar1;
  auVar152._4_4_ = fVar214 * pfVar1[1];
  auVar152._8_4_ = fVar214 * pfVar1[2];
  auVar152._12_4_ = fVar214 * pfVar1[3];
  lVar7 = *(long *)(_Var6 + lVar63);
  fVar214 = 1.0 - fVar214;
  auVar130._4_4_ = fVar214;
  auVar130._0_4_ = fVar214;
  auVar130._8_4_ = fVar214;
  auVar130._12_4_ = fVar214;
  auVar69 = vfmadd231ps_fma(auVar175,auVar130,*(undefined1 (*) [16])(lVar7 + lVar64 * uVar66));
  auVar77 = vfmadd231ps_fma(auVar191,auVar130,*(undefined1 (*) [16])(lVar7 + lVar64 * (uVar66 + 1)))
  ;
  auVar78 = vfmadd231ps_fma(auVar198,auVar130,*(undefined1 (*) [16])(lVar7 + lVar64 * (uVar66 + 2)))
  ;
  auVar70 = vfmadd231ps_fma(auVar152,auVar130,*(undefined1 (*) [16])(lVar7 + lVar64 * (uVar66 + 3)))
  ;
  auVar209._0_4_ = auVar69._0_4_ + auVar77._0_4_ + auVar78._0_4_ + auVar70._0_4_;
  auVar209._4_4_ = auVar69._4_4_ + auVar77._4_4_ + auVar78._4_4_ + auVar70._4_4_;
  auVar209._8_4_ = auVar69._8_4_ + auVar77._8_4_ + auVar78._8_4_ + auVar70._8_4_;
  auVar209._12_4_ = auVar69._12_4_ + auVar77._12_4_ + auVar78._12_4_ + auVar70._12_4_;
  aVar2 = (ray->super_RayK<1>).org.field_0;
  aVar3 = (ray->super_RayK<1>).dir.field_0.field_1;
  auVar26._8_4_ = 0x3e800000;
  auVar26._0_8_ = 0x3e8000003e800000;
  auVar26._12_4_ = 0x3e800000;
  local_460._16_16_ = auVar94._16_16_;
  auVar76 = vmulps_avx512vl(auVar209,auVar26);
  auVar76 = vsubps_avx(auVar76,(undefined1  [16])aVar2);
  auVar76 = vdpps_avx(auVar76,(undefined1  [16])aVar3,0x7f);
  auVar75 = vdpps_avx((undefined1  [16])aVar3,(undefined1  [16])aVar3,0x7f);
  auVar235._4_12_ = auVar249._4_12_;
  auVar235._0_4_ = auVar75._0_4_;
  local_460._0_16_ = vrcp14ss_avx512f(auVar249._0_16_,auVar235);
  auVar75 = vfnmadd213ss_fma(local_460._0_16_,auVar75,ZEXT416(0x40000000));
  fVar214 = auVar76._0_4_ * local_460._0_4_ * auVar75._0_4_;
  local_6a0 = ZEXT416((uint)fVar214);
  auVar230._4_4_ = fVar214;
  auVar230._0_4_ = fVar214;
  auVar230._8_4_ = fVar214;
  auVar230._12_4_ = fVar214;
  fStack_6f0 = fVar214;
  _local_700 = auVar230;
  fStack_6ec = fVar214;
  fStack_6e8 = fVar214;
  fStack_6e4 = fVar214;
  auVar76 = vfmadd231ps_fma((undefined1  [16])aVar2,(undefined1  [16])aVar3,auVar230);
  auVar76 = vblendps_avx(auVar76,auVar249._0_16_,8);
  auVar75 = vsubps_avx(auVar69,auVar76);
  uVar206 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
  local_520._4_4_ = uVar206;
  local_520._0_4_ = uVar206;
  local_520._8_4_ = uVar206;
  local_520._12_4_ = uVar206;
  local_520._16_4_ = uVar206;
  local_520._20_4_ = uVar206;
  local_520._24_4_ = uVar206;
  local_520._28_4_ = uVar206;
  auVar237 = ZEXT3264(local_520);
  auVar69 = vsubps_avx(auVar78,auVar76);
  uVar206 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
  local_540._4_4_ = uVar206;
  local_540._0_4_ = uVar206;
  local_540._8_4_ = uVar206;
  local_540._12_4_ = uVar206;
  local_540._16_4_ = uVar206;
  local_540._20_4_ = uVar206;
  local_540._24_4_ = uVar206;
  local_540._28_4_ = uVar206;
  local_560 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 8);
  uStack_55c = local_560;
  uStack_558 = local_560;
  uStack_554 = local_560;
  uStack_550 = local_560;
  uStack_54c = local_560;
  uStack_548 = local_560;
  uStack_544 = local_560;
  auVar77 = vsubps_avx(auVar77,auVar76);
  auVar76 = vsubps_avx(auVar70,auVar76);
  local_1a0 = auVar75._0_4_;
  uStack_19c = local_1a0;
  uStack_198 = local_1a0;
  uStack_194 = local_1a0;
  uStack_190 = local_1a0;
  uStack_18c = local_1a0;
  uStack_188 = local_1a0;
  uStack_184 = local_1a0;
  auVar84._8_4_ = 1;
  auVar84._0_8_ = 0x100000001;
  auVar84._12_4_ = 1;
  auVar84._16_4_ = 1;
  auVar84._20_4_ = 1;
  auVar84._24_4_ = 1;
  auVar84._28_4_ = 1;
  local_5c0 = ZEXT1632(auVar75);
  local_1c0 = vpermps_avx2(auVar84,local_5c0);
  auVar85._8_4_ = 2.8026e-45;
  auVar85._0_8_ = 0x200000002;
  auVar85._12_4_ = 2.8026e-45;
  auVar85._16_4_ = 2.8026e-45;
  auVar85._20_4_ = 2.8026e-45;
  auVar85._24_4_ = 2.8026e-45;
  auVar85._28_4_ = 2.8026e-45;
  local_1e0 = vpermps_avx2(auVar85,local_5c0);
  auVar86._8_4_ = 3;
  auVar86._0_8_ = 0x300000003;
  auVar86._12_4_ = 3;
  auVar86._16_4_ = 3;
  auVar86._20_4_ = 3;
  auVar86._24_4_ = 3;
  auVar86._28_4_ = 3;
  local_200 = vpermps_avx2(auVar86,local_5c0);
  local_220 = auVar77._0_4_;
  fStack_21c = local_220;
  fStack_218 = local_220;
  fStack_214 = local_220;
  fStack_210 = local_220;
  fStack_20c = local_220;
  fStack_208 = local_220;
  fStack_204 = local_220;
  local_600 = ZEXT1632(auVar77);
  local_240 = vpermps_avx2(auVar84,local_600);
  local_260 = vpermps_avx2(auVar85,local_600);
  local_280 = vpermps_avx2(auVar86,local_600);
  local_2a0 = auVar69._0_4_;
  uStack_29c = local_2a0;
  uStack_298 = local_2a0;
  uStack_294 = local_2a0;
  uStack_290 = local_2a0;
  uStack_28c = local_2a0;
  uStack_288 = local_2a0;
  uStack_284 = local_2a0;
  local_5e0 = ZEXT1632(auVar69);
  local_2c0 = vpermps_avx2(auVar84,local_5e0);
  local_2e0 = vpermps_avx2(auVar85,local_5e0);
  local_300 = vpermps_avx2(auVar86,local_5e0);
  uVar206 = auVar76._0_4_;
  local_320._4_4_ = uVar206;
  local_320._0_4_ = uVar206;
  fStack_318 = (float)uVar206;
  fStack_314 = (float)uVar206;
  fStack_310 = (float)uVar206;
  fStack_30c = (float)uVar206;
  fStack_308 = (float)uVar206;
  register0x0000131c = uVar206;
  auVar205 = ZEXT3264(_local_320);
  _local_620 = ZEXT1632(auVar76);
  _local_340 = vpermps_avx2(auVar84,_local_620);
  _local_360 = vpermps_avx2(auVar85,_local_620);
  local_380 = vpermps_avx2(auVar86,_local_620);
  auVar94 = vpermps_avx2(auVar85,ZEXT1632(CONCAT412(aVar3.field_3.w * aVar3.field_3.w,
                                                    CONCAT48(aVar3.z * aVar3.z,
                                                             CONCAT44(aVar3.y * aVar3.y,
                                                                      aVar3.x * aVar3.x)))));
  auVar76 = vfmadd231ps_fma(auVar94,local_540,local_540);
  auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),local_520,local_520);
  local_3a0 = ZEXT1632(auVar76);
  auVar83._8_4_ = 0x7fffffff;
  auVar83._0_8_ = 0x7fffffff7fffffff;
  auVar83._12_4_ = 0x7fffffff;
  auVar83._16_4_ = 0x7fffffff;
  auVar83._20_4_ = 0x7fffffff;
  auVar83._24_4_ = 0x7fffffff;
  auVar83._28_4_ = 0x7fffffff;
  vandps_avx512vl(ZEXT1632(auVar76),auVar83);
  local_748 = 1;
  local_7d8 = 0;
  auVar195 = ZEXT1664(ZEXT816(0x3f80000000000000));
  do {
    auVar76 = vmovshdup_avx(auVar195._0_16_);
    fVar127 = auVar195._0_4_;
    fVar214 = auVar76._0_4_ - fVar127;
    fVar241 = fVar214 * 0.04761905;
    local_790 = auVar195._0_16_;
    local_880._4_4_ = fVar127;
    local_880._0_4_ = fVar127;
    local_880._8_4_ = fVar127;
    local_880._12_4_ = fVar127;
    local_880._16_4_ = fVar127;
    local_880._20_4_ = fVar127;
    local_880._24_4_ = fVar127;
    local_880._28_4_ = fVar127;
    local_720._4_4_ = fVar214;
    local_720._0_4_ = fVar214;
    local_720._8_4_ = fVar214;
    local_720._12_4_ = fVar214;
    local_720._16_4_ = fVar214;
    local_720._20_4_ = fVar214;
    local_720._24_4_ = fVar214;
    local_720._28_4_ = fVar214;
    auVar76 = vfmadd231ps_fma(local_880,local_720,auVar243._0_32_);
    auVar108._8_4_ = 0x3f800000;
    auVar108._0_8_ = &DAT_3f8000003f800000;
    auVar108._12_4_ = 0x3f800000;
    auVar108._16_4_ = 0x3f800000;
    auVar108._20_4_ = 0x3f800000;
    auVar108._24_4_ = 0x3f800000;
    auVar108._28_4_ = 0x3f800000;
    auVar94 = vsubps_avx(auVar108,ZEXT1632(auVar76));
    auVar99._4_4_ = fStack_21c;
    auVar99._0_4_ = local_220;
    auVar99._8_4_ = fStack_218;
    auVar99._12_4_ = fStack_214;
    auVar99._16_4_ = fStack_210;
    auVar99._20_4_ = fStack_20c;
    auVar99._24_4_ = fStack_208;
    auVar99._28_4_ = fStack_204;
    fVar214 = auVar76._0_4_;
    fVar222 = auVar76._4_4_;
    auVar97._4_4_ = fStack_21c * fVar222;
    auVar97._0_4_ = local_220 * fVar214;
    fVar223 = auVar76._8_4_;
    auVar97._8_4_ = fStack_218 * fVar223;
    fVar224 = auVar76._12_4_;
    auVar97._12_4_ = fStack_214 * fVar224;
    auVar97._16_4_ = fStack_210 * 0.0;
    auVar97._20_4_ = fStack_20c * 0.0;
    auVar97._24_4_ = fStack_208 * 0.0;
    auVar97._28_4_ = auVar85._28_4_;
    auVar243._0_4_ = local_240._0_4_ * fVar214;
    auVar243._4_4_ = local_240._4_4_ * fVar222;
    auVar243._8_4_ = local_240._8_4_ * fVar223;
    auVar243._12_4_ = local_240._12_4_ * fVar224;
    auVar243._16_4_ = local_240._16_4_ * 0.0;
    auVar243._20_4_ = local_240._20_4_ * 0.0;
    auVar243._28_36_ = auVar195._28_36_;
    auVar243._24_4_ = local_240._24_4_ * 0.0;
    auVar249._0_4_ = local_260._0_4_ * fVar214;
    auVar249._4_4_ = local_260._4_4_ * fVar222;
    auVar249._8_4_ = local_260._8_4_ * fVar223;
    auVar249._12_4_ = local_260._12_4_ * fVar224;
    auVar249._16_4_ = local_260._16_4_ * 0.0;
    auVar249._20_4_ = local_260._20_4_ * 0.0;
    auVar249._28_36_ = auVar205._28_36_;
    auVar249._24_4_ = local_260._24_4_ * 0.0;
    auVar195._0_4_ = local_280._0_4_ * fVar214;
    auVar195._4_4_ = local_280._4_4_ * fVar222;
    auVar195._8_4_ = local_280._8_4_ * fVar223;
    auVar195._12_4_ = local_280._12_4_ * fVar224;
    auVar195._16_4_ = local_280._16_4_ * 0.0;
    auVar195._20_4_ = local_280._20_4_ * 0.0;
    auVar195._28_36_ = auVar237._28_36_;
    auVar195._24_4_ = local_280._24_4_ * 0.0;
    auVar100._4_4_ = uStack_19c;
    auVar100._0_4_ = local_1a0;
    auVar100._8_4_ = uStack_198;
    auVar100._12_4_ = uStack_194;
    auVar100._16_4_ = uStack_190;
    auVar100._20_4_ = uStack_18c;
    auVar100._24_4_ = uStack_188;
    auVar100._28_4_ = uStack_184;
    auVar75 = vfmadd231ps_fma(auVar97,auVar94,auVar100);
    auVar69 = vfmadd231ps_fma(auVar243._0_32_,auVar94,local_1c0);
    auVar77 = vfmadd231ps_fma(auVar249._0_32_,auVar94,local_1e0);
    auVar78 = vfmadd231ps_fma(auVar195._0_32_,auVar94,local_200);
    auVar98._4_4_ = uStack_29c;
    auVar98._0_4_ = local_2a0;
    auVar98._8_4_ = uStack_298;
    auVar98._12_4_ = uStack_294;
    auVar98._16_4_ = uStack_290;
    auVar98._20_4_ = uStack_28c;
    auVar98._24_4_ = uStack_288;
    auVar98._28_4_ = uStack_284;
    auVar83 = vmulps_avx512vl(auVar98,ZEXT1632(auVar76));
    auVar90 = ZEXT1632(auVar76);
    auVar84 = vmulps_avx512vl(local_2c0,auVar90);
    auVar85 = vmulps_avx512vl(local_2e0,auVar90);
    auVar86 = vmulps_avx512vl(local_300,auVar90);
    auVar70 = vfmadd231ps_fma(auVar83,auVar94,auVar99);
    auVar79 = vfmadd231ps_fma(auVar84,auVar94,local_240);
    auVar80 = vfmadd231ps_fma(auVar85,auVar94,local_260);
    auVar71 = vfmadd231ps_fma(auVar86,auVar94,local_280);
    auVar91._4_4_ = fVar222 * (float)local_320._4_4_;
    auVar91._0_4_ = fVar214 * (float)local_320._0_4_;
    auVar91._8_4_ = fVar223 * fStack_318;
    auVar91._12_4_ = fVar224 * fStack_314;
    auVar91._16_4_ = fStack_310 * 0.0;
    auVar91._20_4_ = fStack_30c * 0.0;
    auVar91._24_4_ = fStack_308 * 0.0;
    auVar91._28_4_ = local_240._28_4_;
    auVar92._4_4_ = fVar222 * (float)local_340._4_4_;
    auVar92._0_4_ = fVar214 * (float)local_340._0_4_;
    auVar92._8_4_ = fVar223 * fStack_338;
    auVar92._12_4_ = fVar224 * fStack_334;
    auVar92._16_4_ = fStack_330 * 0.0;
    auVar92._20_4_ = fStack_32c * 0.0;
    auVar92._24_4_ = fStack_328 * 0.0;
    auVar92._28_4_ = local_260._28_4_;
    auVar93._4_4_ = fVar222 * (float)local_360._4_4_;
    auVar93._0_4_ = fVar214 * (float)local_360._0_4_;
    auVar93._8_4_ = fVar223 * fStack_358;
    auVar93._12_4_ = fVar224 * fStack_354;
    auVar93._16_4_ = fStack_350 * 0.0;
    auVar93._20_4_ = fStack_34c * 0.0;
    auVar93._24_4_ = fStack_348 * 0.0;
    auVar93._28_4_ = local_280._28_4_;
    auVar83 = vmulps_avx512vl(auVar90,local_380);
    auVar84 = vfmadd231ps_avx512vl(auVar91,auVar94,auVar98);
    auVar85 = vfmadd231ps_avx512vl(auVar92,auVar94,local_2c0);
    auVar86 = vfmadd231ps_avx512vl(auVar93,auVar94,local_2e0);
    auVar83 = vfmadd231ps_avx512vl(auVar83,auVar94,local_300);
    auVar87 = vmulps_avx512vl(auVar90,ZEXT1632(auVar70));
    auVar88 = vmulps_avx512vl(auVar90,ZEXT1632(auVar79));
    auVar89 = vmulps_avx512vl(auVar90,ZEXT1632(auVar80));
    auVar90 = vmulps_avx512vl(auVar90,ZEXT1632(auVar71));
    auVar87 = vfmadd231ps_avx512vl(auVar87,auVar94,ZEXT1632(auVar75));
    auVar88 = vfmadd231ps_avx512vl(auVar88,auVar94,ZEXT1632(auVar69));
    auVar89 = vfmadd231ps_avx512vl(auVar89,auVar94,ZEXT1632(auVar77));
    auVar90 = vfmadd231ps_avx512vl(auVar90,auVar94,ZEXT1632(auVar78));
    auVar107._0_4_ = auVar84._0_4_ * fVar214;
    auVar107._4_4_ = auVar84._4_4_ * fVar222;
    auVar107._8_4_ = auVar84._8_4_ * fVar223;
    auVar107._12_4_ = auVar84._12_4_ * fVar224;
    auVar107._16_4_ = auVar84._16_4_ * 0.0;
    auVar107._20_4_ = auVar84._20_4_ * 0.0;
    auVar107._24_4_ = auVar84._24_4_ * 0.0;
    auVar107._28_4_ = 0;
    auVar95._4_4_ = auVar85._4_4_ * fVar222;
    auVar95._0_4_ = auVar85._0_4_ * fVar214;
    auVar95._8_4_ = auVar85._8_4_ * fVar223;
    auVar95._12_4_ = auVar85._12_4_ * fVar224;
    auVar95._16_4_ = auVar85._16_4_ * 0.0;
    auVar95._20_4_ = auVar85._20_4_ * 0.0;
    auVar95._24_4_ = auVar85._24_4_ * 0.0;
    auVar95._28_4_ = auVar84._28_4_;
    auVar96._4_4_ = auVar86._4_4_ * fVar222;
    auVar96._0_4_ = auVar86._0_4_ * fVar214;
    auVar96._8_4_ = auVar86._8_4_ * fVar223;
    auVar96._12_4_ = auVar86._12_4_ * fVar224;
    auVar96._16_4_ = auVar86._16_4_ * 0.0;
    auVar96._20_4_ = auVar86._20_4_ * 0.0;
    auVar96._24_4_ = auVar86._24_4_ * 0.0;
    auVar96._28_4_ = auVar85._28_4_;
    auVar83 = vmulps_avx512vl(ZEXT1632(auVar76),auVar83);
    auVar76 = vfmadd231ps_fma(auVar107,auVar94,ZEXT1632(auVar70));
    auVar75 = vfmadd231ps_fma(auVar95,auVar94,ZEXT1632(auVar79));
    auVar69 = vfmadd231ps_fma(auVar96,auVar94,ZEXT1632(auVar80));
    auVar77 = vfmadd231ps_fma(auVar83,auVar94,ZEXT1632(auVar71));
    auVar91 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar76._12_4_ * fVar224,
                                            CONCAT48(auVar76._8_4_ * fVar223,
                                                     CONCAT44(auVar76._4_4_ * fVar222,
                                                              auVar76._0_4_ * fVar214)))),auVar94,
                         auVar87);
    auVar205 = ZEXT3264(auVar91);
    auVar92 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar75._12_4_ * fVar224,
                                            CONCAT48(auVar75._8_4_ * fVar223,
                                                     CONCAT44(auVar75._4_4_ * fVar222,
                                                              auVar75._0_4_ * fVar214)))),auVar94,
                         auVar88);
    auVar93 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar69._12_4_ * fVar224,
                                            CONCAT48(auVar69._8_4_ * fVar223,
                                                     CONCAT44(auVar69._4_4_ * fVar222,
                                                              auVar69._0_4_ * fVar214)))),auVar94,
                         auVar89);
    auVar84 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar77._12_4_ * fVar224,
                                            CONCAT48(auVar77._8_4_ * fVar223,
                                                     CONCAT44(auVar77._4_4_ * fVar222,
                                                              auVar77._0_4_ * fVar214)))),auVar90,
                         auVar94);
    auVar94 = vsubps_avx512vl(ZEXT1632(auVar76),auVar87);
    auVar83 = vsubps_avx512vl(ZEXT1632(auVar75),auVar88);
    auVar85 = vsubps_avx512vl(ZEXT1632(auVar69),auVar89);
    auVar86 = vsubps_avx512vl(ZEXT1632(auVar77),auVar90);
    auVar110._0_4_ = fVar241 * auVar94._0_4_ * 3.0;
    auVar110._4_4_ = fVar241 * auVar94._4_4_ * 3.0;
    auVar110._8_4_ = fVar241 * auVar94._8_4_ * 3.0;
    auVar110._12_4_ = fVar241 * auVar94._12_4_ * 3.0;
    auVar110._16_4_ = fVar241 * auVar94._16_4_ * 3.0;
    auVar110._20_4_ = fVar241 * auVar94._20_4_ * 3.0;
    auVar110._24_4_ = fVar241 * auVar94._24_4_ * 3.0;
    auVar110._28_4_ = 0;
    auVar111._0_4_ = auVar83._0_4_ * 3.0 * fVar241;
    auVar111._4_4_ = auVar83._4_4_ * 3.0 * fVar241;
    auVar111._8_4_ = auVar83._8_4_ * 3.0 * fVar241;
    auVar111._12_4_ = auVar83._12_4_ * 3.0 * fVar241;
    auVar111._16_4_ = auVar83._16_4_ * 3.0 * fVar241;
    auVar111._20_4_ = auVar83._20_4_ * 3.0 * fVar241;
    auVar111._24_4_ = auVar83._24_4_ * 3.0 * fVar241;
    auVar111._28_4_ = 0;
    auVar112._0_4_ = auVar85._0_4_ * 3.0 * fVar241;
    auVar112._4_4_ = auVar85._4_4_ * 3.0 * fVar241;
    auVar112._8_4_ = auVar85._8_4_ * 3.0 * fVar241;
    auVar112._12_4_ = auVar85._12_4_ * 3.0 * fVar241;
    auVar112._16_4_ = auVar85._16_4_ * 3.0 * fVar241;
    auVar112._20_4_ = auVar85._20_4_ * 3.0 * fVar241;
    auVar112._24_4_ = auVar85._24_4_ * 3.0 * fVar241;
    auVar112._28_4_ = 0;
    fVar214 = auVar86._0_4_ * 3.0 * fVar241;
    fVar222 = auVar86._4_4_ * 3.0 * fVar241;
    auVar102._4_4_ = fVar222;
    auVar102._0_4_ = fVar214;
    fVar223 = auVar86._8_4_ * 3.0 * fVar241;
    auVar102._8_4_ = fVar223;
    fVar224 = auVar86._12_4_ * 3.0 * fVar241;
    auVar102._12_4_ = fVar224;
    fVar225 = auVar86._16_4_ * 3.0 * fVar241;
    auVar102._16_4_ = fVar225;
    fVar226 = auVar86._20_4_ * 3.0 * fVar241;
    auVar102._20_4_ = fVar226;
    fVar227 = auVar86._24_4_ * 3.0 * fVar241;
    auVar102._24_4_ = fVar227;
    auVar102._28_4_ = fVar241;
    auVar76 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
    auVar95 = vpermt2ps_avx512vl(auVar91,_DAT_0205fd20,ZEXT1632(auVar76));
    auVar237 = ZEXT3264(auVar95);
    auVar96 = vpermt2ps_avx512vl(auVar92,_DAT_0205fd20,ZEXT1632(auVar76));
    auVar85 = ZEXT1632(auVar76);
    auVar97 = vpermt2ps_avx512vl(auVar93,_DAT_0205fd20,auVar85);
    auVar106._0_4_ = auVar84._0_4_ + fVar214;
    auVar106._4_4_ = auVar84._4_4_ + fVar222;
    auVar106._8_4_ = auVar84._8_4_ + fVar223;
    auVar106._12_4_ = auVar84._12_4_ + fVar224;
    auVar106._16_4_ = auVar84._16_4_ + fVar225;
    auVar106._20_4_ = auVar84._20_4_ + fVar226;
    auVar106._24_4_ = auVar84._24_4_ + fVar227;
    auVar106._28_4_ = auVar84._28_4_ + fVar241;
    auVar94 = vmaxps_avx(auVar84,auVar106);
    auVar83 = vminps_avx(auVar84,auVar106);
    auVar87 = vpermt2ps_avx512vl(auVar84,_DAT_0205fd20,auVar85);
    auVar98 = vpermt2ps_avx512vl(auVar110,_DAT_0205fd20,auVar85);
    auVar99 = vpermt2ps_avx512vl(auVar111,_DAT_0205fd20,auVar85);
    auVar106 = ZEXT1632(auVar76);
    auVar100 = vpermt2ps_avx512vl(auVar112,_DAT_0205fd20,auVar106);
    auVar84 = vpermt2ps_avx512vl(auVar102,_DAT_0205fd20,auVar106);
    auVar88 = vsubps_avx512vl(auVar87,auVar84);
    auVar84 = vsubps_avx(auVar95,auVar91);
    auVar85 = vsubps_avx(auVar96,auVar92);
    auVar86 = vsubps_avx(auVar97,auVar93);
    auVar89 = vmulps_avx512vl(auVar85,auVar112);
    auVar89 = vfmsub231ps_avx512vl(auVar89,auVar111,auVar86);
    auVar90 = vmulps_avx512vl(auVar86,auVar110);
    auVar90 = vfmsub231ps_avx512vl(auVar90,auVar112,auVar84);
    auVar101 = vmulps_avx512vl(auVar84,auVar111);
    auVar101 = vfmsub231ps_avx512vl(auVar101,auVar110,auVar85);
    auVar101 = vmulps_avx512vl(auVar101,auVar101);
    auVar90 = vfmadd231ps_avx512vl(auVar101,auVar90,auVar90);
    auVar89 = vfmadd231ps_avx512vl(auVar90,auVar89,auVar89);
    auVar90 = vmulps_avx512vl(auVar86,auVar86);
    auVar90 = vfmadd231ps_avx512vl(auVar90,auVar85,auVar85);
    auVar90 = vfmadd231ps_avx512vl(auVar90,auVar84,auVar84);
    auVar101 = vrcp14ps_avx512vl(auVar90);
    auVar102 = vfnmadd213ps_avx512vl(auVar101,auVar90,auVar108);
    auVar101 = vfmadd132ps_avx512vl(auVar102,auVar101,auVar101);
    auVar89 = vmulps_avx512vl(auVar89,auVar101);
    auVar102 = vmulps_avx512vl(auVar85,auVar100);
    auVar102 = vfmsub231ps_avx512vl(auVar102,auVar99,auVar86);
    auVar103 = vmulps_avx512vl(auVar86,auVar98);
    auVar103 = vfmsub231ps_avx512vl(auVar103,auVar100,auVar84);
    auVar104 = vmulps_avx512vl(auVar84,auVar99);
    auVar104 = vfmsub231ps_avx512vl(auVar104,auVar98,auVar85);
    auVar104 = vmulps_avx512vl(auVar104,auVar104);
    auVar103 = vfmadd231ps_avx512vl(auVar104,auVar103,auVar103);
    auVar102 = vfmadd231ps_avx512vl(auVar103,auVar102,auVar102);
    auVar101 = vmulps_avx512vl(auVar102,auVar101);
    auVar89 = vmaxps_avx512vl(auVar89,auVar101);
    auVar89 = vsqrtps_avx512vl(auVar89);
    auVar101 = vmaxps_avx512vl(auVar88,auVar87);
    auVar94 = vmaxps_avx512vl(auVar94,auVar101);
    auVar94 = vaddps_avx512vl(auVar89,auVar94);
    auVar87 = vminps_avx512vl(auVar88,auVar87);
    auVar83 = vminps_avx512vl(auVar83,auVar87);
    auVar83 = vsubps_avx512vl(auVar83,auVar89);
    auVar87._8_4_ = 0x3f800002;
    auVar87._0_8_ = 0x3f8000023f800002;
    auVar87._12_4_ = 0x3f800002;
    auVar87._16_4_ = 0x3f800002;
    auVar87._20_4_ = 0x3f800002;
    auVar87._24_4_ = 0x3f800002;
    auVar87._28_4_ = 0x3f800002;
    auVar94 = vmulps_avx512vl(auVar94,auVar87);
    auVar88._8_4_ = 0x3f7ffffc;
    auVar88._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar88._12_4_ = 0x3f7ffffc;
    auVar88._16_4_ = 0x3f7ffffc;
    auVar88._20_4_ = 0x3f7ffffc;
    auVar88._24_4_ = 0x3f7ffffc;
    auVar88._28_4_ = 0x3f7ffffc;
    local_740 = vmulps_avx512vl(auVar83,auVar88);
    auVar94 = vmulps_avx512vl(auVar94,auVar94);
    auVar83 = vrsqrt14ps_avx512vl(auVar90);
    auVar89._8_4_ = 0xbf000000;
    auVar89._0_8_ = 0xbf000000bf000000;
    auVar89._12_4_ = 0xbf000000;
    auVar89._16_4_ = 0xbf000000;
    auVar89._20_4_ = 0xbf000000;
    auVar89._24_4_ = 0xbf000000;
    auVar89._28_4_ = 0xbf000000;
    auVar87 = vmulps_avx512vl(auVar90,auVar89);
    auVar103._4_4_ = auVar83._4_4_ * auVar87._4_4_;
    auVar103._0_4_ = auVar83._0_4_ * auVar87._0_4_;
    auVar103._8_4_ = auVar83._8_4_ * auVar87._8_4_;
    auVar103._12_4_ = auVar83._12_4_ * auVar87._12_4_;
    auVar103._16_4_ = auVar83._16_4_ * auVar87._16_4_;
    auVar103._20_4_ = auVar83._20_4_ * auVar87._20_4_;
    auVar103._24_4_ = auVar83._24_4_ * auVar87._24_4_;
    auVar103._28_4_ = auVar87._28_4_;
    auVar87 = vmulps_avx512vl(auVar83,auVar83);
    auVar87 = vmulps_avx512vl(auVar87,auVar103);
    auVar90._8_4_ = 0x3fc00000;
    auVar90._0_8_ = 0x3fc000003fc00000;
    auVar90._12_4_ = 0x3fc00000;
    auVar90._16_4_ = 0x3fc00000;
    auVar90._20_4_ = 0x3fc00000;
    auVar90._24_4_ = 0x3fc00000;
    auVar90._28_4_ = 0x3fc00000;
    auVar87 = vfmadd231ps_avx512vl(auVar87,auVar83,auVar90);
    auVar104._4_4_ = auVar87._4_4_ * auVar84._4_4_;
    auVar104._0_4_ = auVar87._0_4_ * auVar84._0_4_;
    auVar104._8_4_ = auVar87._8_4_ * auVar84._8_4_;
    auVar104._12_4_ = auVar87._12_4_ * auVar84._12_4_;
    auVar104._16_4_ = auVar87._16_4_ * auVar84._16_4_;
    auVar104._20_4_ = auVar87._20_4_ * auVar84._20_4_;
    auVar104._24_4_ = auVar87._24_4_ * auVar84._24_4_;
    auVar104._28_4_ = auVar83._28_4_;
    auVar83 = vmulps_avx512vl(auVar85,auVar87);
    auVar88 = vmulps_avx512vl(auVar86,auVar87);
    auVar89 = vsubps_avx512vl(auVar106,auVar91);
    auVar90 = vsubps_avx512vl(auVar106,auVar92);
    auVar102 = vsubps_avx512vl(auVar106,auVar93);
    auVar105._4_4_ = uStack_55c;
    auVar105._0_4_ = local_560;
    auVar105._8_4_ = uStack_558;
    auVar105._12_4_ = uStack_554;
    auVar105._16_4_ = uStack_550;
    auVar105._20_4_ = uStack_54c;
    auVar105._24_4_ = uStack_548;
    auVar105._28_4_ = uStack_544;
    auVar101 = vmulps_avx512vl(auVar105,auVar102);
    auVar101 = vfmadd231ps_avx512vl(auVar101,local_540,auVar90);
    auVar101 = vfmadd231ps_avx512vl(auVar101,local_520,auVar89);
    auVar103 = vmulps_avx512vl(auVar102,auVar102);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar90,auVar90);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar89,auVar89);
    auVar105 = vmulps_avx512vl(auVar105,auVar88);
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar83,local_540);
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar104,local_520);
    auVar88 = vmulps_avx512vl(auVar102,auVar88);
    auVar83 = vfmadd231ps_avx512vl(auVar88,auVar90,auVar83);
    auVar83 = vfmadd231ps_avx512vl(auVar83,auVar89,auVar104);
    local_6e0 = vmulps_avx512vl(auVar105,auVar105);
    auVar88 = vsubps_avx512vl(local_3a0,local_6e0);
    auVar104 = vmulps_avx512vl(auVar105,auVar83);
    auVar101 = vsubps_avx512vl(auVar101,auVar104);
    auVar104 = vaddps_avx512vl(auVar101,auVar101);
    auVar101 = vmulps_avx512vl(auVar83,auVar83);
    local_840 = vsubps_avx512vl(auVar103,auVar101);
    auVar103 = vsubps_avx512vl(local_840,auVar94);
    local_820 = vmulps_avx512vl(auVar104,auVar104);
    auVar101._8_4_ = 0x40800000;
    auVar101._0_8_ = 0x4080000040800000;
    auVar101._12_4_ = 0x40800000;
    auVar101._16_4_ = 0x40800000;
    auVar101._20_4_ = 0x40800000;
    auVar101._24_4_ = 0x40800000;
    auVar101._28_4_ = 0x40800000;
    auVar101 = vmulps_avx512vl(auVar88,auVar101);
    auVar94 = vmulps_avx512vl(auVar101,auVar103);
    auVar94 = vsubps_avx512vl(local_820,auVar94);
    uVar66 = vcmpps_avx512vl(auVar94,auVar106,5);
    bVar58 = (byte)uVar66;
    if (bVar58 == 0) {
      auVar109 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar113 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar94 = auVar113;
    }
    else {
      auVar94 = vsqrtps_avx512vl(auVar94);
      auVar106 = vaddps_avx512vl(auVar88,auVar88);
      auVar107 = vrcp14ps_avx512vl(auVar106);
      auVar108 = vfnmadd213ps_avx512vl(auVar106,auVar107,auVar108);
      auVar108 = vfmadd132ps_avx512vl(auVar108,auVar107,auVar107);
      auVar34._8_4_ = 0x80000000;
      auVar34._0_8_ = 0x8000000080000000;
      auVar34._12_4_ = 0x80000000;
      auVar34._16_4_ = 0x80000000;
      auVar34._20_4_ = 0x80000000;
      auVar34._24_4_ = 0x80000000;
      auVar34._28_4_ = 0x80000000;
      auVar106 = vxorps_avx512vl(auVar104,auVar34);
      auVar106 = vsubps_avx512vl(auVar106,auVar94);
      auVar106 = vmulps_avx512vl(auVar106,auVar108);
      auVar94 = vsubps_avx512vl(auVar94,auVar104);
      auVar94 = vmulps_avx512vl(auVar94,auVar108);
      auVar108 = vfmadd213ps_avx512vl(auVar105,auVar106,auVar83);
      local_4c0 = vmulps_avx512vl(auVar87,auVar108);
      auVar108 = vfmadd213ps_avx512vl(auVar105,auVar94,auVar83);
      local_4e0 = vmulps_avx512vl(auVar87,auVar108);
      auVar137._8_4_ = 0x7f800000;
      auVar137._0_8_ = 0x7f8000007f800000;
      auVar137._12_4_ = 0x7f800000;
      auVar137._16_4_ = 0x7f800000;
      auVar137._20_4_ = 0x7f800000;
      auVar137._24_4_ = 0x7f800000;
      auVar137._28_4_ = 0x7f800000;
      auVar108 = vblendmps_avx512vl(auVar137,auVar106);
      auVar109._0_4_ =
           (uint)(bVar58 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar58 & 1) * local_4e0._0_4_;
      bVar10 = (bool)((byte)(uVar66 >> 1) & 1);
      auVar109._4_4_ = (uint)bVar10 * auVar108._4_4_ | (uint)!bVar10 * local_4e0._4_4_;
      bVar10 = (bool)((byte)(uVar66 >> 2) & 1);
      auVar109._8_4_ = (uint)bVar10 * auVar108._8_4_ | (uint)!bVar10 * local_4e0._8_4_;
      bVar10 = (bool)((byte)(uVar66 >> 3) & 1);
      auVar109._12_4_ = (uint)bVar10 * auVar108._12_4_ | (uint)!bVar10 * local_4e0._12_4_;
      bVar10 = (bool)((byte)(uVar66 >> 4) & 1);
      auVar109._16_4_ = (uint)bVar10 * auVar108._16_4_ | (uint)!bVar10 * local_4e0._16_4_;
      bVar10 = (bool)((byte)(uVar66 >> 5) & 1);
      auVar109._20_4_ = (uint)bVar10 * auVar108._20_4_ | (uint)!bVar10 * local_4e0._20_4_;
      bVar10 = (bool)((byte)(uVar66 >> 6) & 1);
      auVar109._24_4_ = (uint)bVar10 * auVar108._24_4_ | (uint)!bVar10 * local_4e0._24_4_;
      bVar10 = SUB81(uVar66 >> 7,0);
      auVar109._28_4_ = (uint)bVar10 * auVar108._28_4_ | (uint)!bVar10 * local_4e0._28_4_;
      auVar138._8_4_ = 0xff800000;
      auVar138._0_8_ = 0xff800000ff800000;
      auVar138._12_4_ = 0xff800000;
      auVar138._16_4_ = 0xff800000;
      auVar138._20_4_ = 0xff800000;
      auVar138._24_4_ = 0xff800000;
      auVar138._28_4_ = 0xff800000;
      auVar108 = vblendmps_avx512vl(auVar138,auVar94);
      auVar113._0_4_ =
           (uint)(bVar58 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar58 & 1) * auVar94._0_4_;
      bVar10 = (bool)((byte)(uVar66 >> 1) & 1);
      auVar113._4_4_ = (uint)bVar10 * auVar108._4_4_ | (uint)!bVar10 * auVar94._4_4_;
      bVar10 = (bool)((byte)(uVar66 >> 2) & 1);
      auVar113._8_4_ = (uint)bVar10 * auVar108._8_4_ | (uint)!bVar10 * auVar94._8_4_;
      bVar10 = (bool)((byte)(uVar66 >> 3) & 1);
      auVar113._12_4_ = (uint)bVar10 * auVar108._12_4_ | (uint)!bVar10 * auVar94._12_4_;
      bVar10 = (bool)((byte)(uVar66 >> 4) & 1);
      auVar113._16_4_ = (uint)bVar10 * auVar108._16_4_ | (uint)!bVar10 * auVar94._16_4_;
      bVar10 = (bool)((byte)(uVar66 >> 5) & 1);
      auVar113._20_4_ = (uint)bVar10 * auVar108._20_4_ | (uint)!bVar10 * auVar94._20_4_;
      bVar10 = (bool)((byte)(uVar66 >> 6) & 1);
      auVar113._24_4_ = (uint)bVar10 * auVar108._24_4_ | (uint)!bVar10 * auVar94._24_4_;
      bVar10 = SUB81(uVar66 >> 7,0);
      auVar113._28_4_ = (uint)bVar10 * auVar108._28_4_ | (uint)!bVar10 * auVar94._28_4_;
      auVar139._8_4_ = 0x7fffffff;
      auVar139._0_8_ = 0x7fffffff7fffffff;
      auVar139._12_4_ = 0x7fffffff;
      auVar139._16_4_ = 0x7fffffff;
      auVar139._20_4_ = 0x7fffffff;
      auVar139._24_4_ = 0x7fffffff;
      auVar139._28_4_ = 0x7fffffff;
      vandps_avx512vl(local_6e0,auVar139);
      auVar94 = vmaxps_avx512vl(local_460,local_6e0);
      auVar35._8_4_ = 0x36000000;
      auVar35._0_8_ = 0x3600000036000000;
      auVar35._12_4_ = 0x36000000;
      auVar35._16_4_ = 0x36000000;
      auVar35._20_4_ = 0x36000000;
      auVar35._24_4_ = 0x36000000;
      auVar35._28_4_ = 0x36000000;
      auVar94 = vmulps_avx512vl(auVar94,auVar35);
      auVar108 = vandps_avx(auVar88,auVar139);
      uVar60 = vcmpps_avx512vl(auVar108,auVar94,1);
      uVar66 = uVar66 & uVar60;
      bVar62 = (byte)uVar66;
      auVar94 = local_6e0;
      if (bVar62 != 0) {
        uVar60 = vcmpps_avx512vl(auVar103,_DAT_02020f00,2);
        auVar171._8_4_ = 0xff800000;
        auVar171._0_8_ = 0xff800000ff800000;
        auVar171._12_4_ = 0xff800000;
        auVar171._16_4_ = 0xff800000;
        auVar171._20_4_ = 0xff800000;
        auVar171._24_4_ = 0xff800000;
        auVar171._28_4_ = 0xff800000;
        auVar103 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar106 = vblendmps_avx512vl(auVar103,auVar171);
        bVar61 = (byte)uVar60;
        uVar67 = (uint)(bVar61 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar61 & 1) * auVar108._0_4_;
        bVar10 = (bool)((byte)(uVar60 >> 1) & 1);
        uVar120 = (uint)bVar10 * auVar106._4_4_ | (uint)!bVar10 * auVar108._4_4_;
        bVar10 = (bool)((byte)(uVar60 >> 2) & 1);
        uVar121 = (uint)bVar10 * auVar106._8_4_ | (uint)!bVar10 * auVar108._8_4_;
        bVar10 = (bool)((byte)(uVar60 >> 3) & 1);
        uVar122 = (uint)bVar10 * auVar106._12_4_ | (uint)!bVar10 * auVar108._12_4_;
        bVar10 = (bool)((byte)(uVar60 >> 4) & 1);
        uVar123 = (uint)bVar10 * auVar106._16_4_ | (uint)!bVar10 * auVar108._16_4_;
        bVar10 = (bool)((byte)(uVar60 >> 5) & 1);
        uVar124 = (uint)bVar10 * auVar106._20_4_ | (uint)!bVar10 * auVar108._20_4_;
        bVar10 = (bool)((byte)(uVar60 >> 6) & 1);
        uVar125 = (uint)bVar10 * auVar106._24_4_ | (uint)!bVar10 * auVar108._24_4_;
        bVar10 = SUB81(uVar60 >> 7,0);
        uVar126 = (uint)bVar10 * auVar106._28_4_ | (uint)!bVar10 * auVar108._28_4_;
        auVar109._0_4_ = (bVar62 & 1) * uVar67 | !(bool)(bVar62 & 1) * auVar109._0_4_;
        bVar10 = (bool)((byte)(uVar66 >> 1) & 1);
        auVar109._4_4_ = bVar10 * uVar120 | !bVar10 * auVar109._4_4_;
        bVar10 = (bool)((byte)(uVar66 >> 2) & 1);
        auVar109._8_4_ = bVar10 * uVar121 | !bVar10 * auVar109._8_4_;
        bVar10 = (bool)((byte)(uVar66 >> 3) & 1);
        auVar109._12_4_ = bVar10 * uVar122 | !bVar10 * auVar109._12_4_;
        bVar10 = (bool)((byte)(uVar66 >> 4) & 1);
        auVar109._16_4_ = bVar10 * uVar123 | !bVar10 * auVar109._16_4_;
        bVar10 = (bool)((byte)(uVar66 >> 5) & 1);
        auVar109._20_4_ = bVar10 * uVar124 | !bVar10 * auVar109._20_4_;
        bVar10 = (bool)((byte)(uVar66 >> 6) & 1);
        auVar109._24_4_ = bVar10 * uVar125 | !bVar10 * auVar109._24_4_;
        bVar10 = SUB81(uVar66 >> 7,0);
        auVar109._28_4_ = bVar10 * uVar126 | !bVar10 * auVar109._28_4_;
        auVar103 = vblendmps_avx512vl(auVar171,auVar103);
        bVar10 = (bool)((byte)(uVar60 >> 1) & 1);
        bVar11 = (bool)((byte)(uVar60 >> 2) & 1);
        bVar12 = (bool)((byte)(uVar60 >> 3) & 1);
        bVar13 = (bool)((byte)(uVar60 >> 4) & 1);
        bVar14 = (bool)((byte)(uVar60 >> 5) & 1);
        bVar15 = (bool)((byte)(uVar60 >> 6) & 1);
        bVar16 = SUB81(uVar60 >> 7,0);
        auVar113._0_4_ =
             (uint)(bVar62 & 1) *
             ((uint)(bVar61 & 1) * auVar103._0_4_ | !(bool)(bVar61 & 1) * uVar67) |
             !(bool)(bVar62 & 1) * auVar113._0_4_;
        bVar65 = (bool)((byte)(uVar66 >> 1) & 1);
        auVar113._4_4_ =
             (uint)bVar65 * ((uint)bVar10 * auVar103._4_4_ | !bVar10 * uVar120) |
             !bVar65 * auVar113._4_4_;
        bVar10 = (bool)((byte)(uVar66 >> 2) & 1);
        auVar113._8_4_ =
             (uint)bVar10 * ((uint)bVar11 * auVar103._8_4_ | !bVar11 * uVar121) |
             !bVar10 * auVar113._8_4_;
        bVar10 = (bool)((byte)(uVar66 >> 3) & 1);
        auVar113._12_4_ =
             (uint)bVar10 * ((uint)bVar12 * auVar103._12_4_ | !bVar12 * uVar122) |
             !bVar10 * auVar113._12_4_;
        bVar10 = (bool)((byte)(uVar66 >> 4) & 1);
        auVar113._16_4_ =
             (uint)bVar10 * ((uint)bVar13 * auVar103._16_4_ | !bVar13 * uVar123) |
             !bVar10 * auVar113._16_4_;
        bVar10 = (bool)((byte)(uVar66 >> 5) & 1);
        auVar113._20_4_ =
             (uint)bVar10 * ((uint)bVar14 * auVar103._20_4_ | !bVar14 * uVar124) |
             !bVar10 * auVar113._20_4_;
        bVar10 = (bool)((byte)(uVar66 >> 6) & 1);
        auVar113._24_4_ =
             (uint)bVar10 * ((uint)bVar15 * auVar103._24_4_ | !bVar15 * uVar125) |
             !bVar10 * auVar113._24_4_;
        bVar10 = SUB81(uVar66 >> 7,0);
        auVar113._28_4_ =
             (uint)bVar10 * ((uint)bVar16 * auVar103._28_4_ | !bVar16 * uVar126) |
             !bVar10 * auVar113._28_4_;
        bVar58 = (~bVar62 | bVar61) & bVar58;
      }
    }
    in_ZMM31 = ZEXT3264(auVar109);
    if ((bVar58 & 0x7f) == 0) {
LAB_01bf5b82:
      auVar249 = ZEXT864(0) << 0x40;
      auVar243 = ZEXT3264(_DAT_02020f20);
    }
    else {
      auVar76 = vsubss_avx512f(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]),local_6a0);
      auVar140._0_4_ = auVar76._0_4_;
      auVar140._4_4_ = auVar140._0_4_;
      auVar140._8_4_ = auVar140._0_4_;
      auVar140._12_4_ = auVar140._0_4_;
      auVar140._16_4_ = auVar140._0_4_;
      auVar140._20_4_ = auVar140._0_4_;
      auVar140._24_4_ = auVar140._0_4_;
      auVar140._28_4_ = auVar140._0_4_;
      auVar94 = vmaxps_avx512vl(auVar140,auVar109);
      auVar76 = vsubss_avx512f(ZEXT416((uint)(ray->super_RayK<1>).tfar),local_6a0);
      auVar167._0_4_ = auVar76._0_4_;
      auVar167._4_4_ = auVar167._0_4_;
      auVar167._8_4_ = auVar167._0_4_;
      auVar167._12_4_ = auVar167._0_4_;
      auVar167._16_4_ = auVar167._0_4_;
      auVar167._20_4_ = auVar167._0_4_;
      auVar167._24_4_ = auVar167._0_4_;
      auVar167._28_4_ = auVar167._0_4_;
      auVar103 = vminps_avx512vl(auVar167,auVar113);
      auVar102 = vmulps_avx512vl(auVar102,auVar112);
      auVar90 = vfmadd213ps_avx512vl(auVar90,auVar111,auVar102);
      auVar89 = vfmadd213ps_avx512vl(auVar89,auVar110,auVar90);
      auVar54._4_4_ = uStack_55c;
      auVar54._0_4_ = local_560;
      auVar54._8_4_ = uStack_558;
      auVar54._12_4_ = uStack_554;
      auVar54._16_4_ = uStack_550;
      auVar54._20_4_ = uStack_54c;
      auVar54._24_4_ = uStack_548;
      auVar54._28_4_ = uStack_544;
      auVar90 = vmulps_avx512vl(auVar54,auVar112);
      auVar90 = vfmadd231ps_avx512vl(auVar90,local_540,auVar111);
      auVar90 = vfmadd231ps_avx512vl(auVar90,local_520,auVar110);
      auVar102 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar90,auVar102);
      auVar108 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar18 = vcmpps_avx512vl(auVar102,auVar108,1);
      auVar106 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      in_ZMM31 = ZEXT3264(auVar106);
      auVar89 = vxorps_avx512vl(auVar89,auVar106);
      auVar107 = vrcp14ps_avx512vl(auVar90);
      auVar110 = vxorps_avx512vl(auVar90,auVar106);
      auVar111 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar112 = vfnmadd213ps_avx512vl(auVar107,auVar90,auVar111);
      auVar112 = vfmadd132ps_avx512vl(auVar112,auVar107,auVar107);
      auVar89 = vmulps_avx512vl(auVar112,auVar89);
      uVar19 = vcmpps_avx512vl(auVar90,auVar110,1);
      bVar62 = (byte)uVar18 | (byte)uVar19;
      auVar112 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar113 = vblendmps_avx512vl(auVar89,auVar112);
      auVar114._0_4_ =
           (uint)(bVar62 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar62 & 1) * auVar107._0_4_;
      bVar10 = (bool)(bVar62 >> 1 & 1);
      auVar114._4_4_ = (uint)bVar10 * auVar113._4_4_ | (uint)!bVar10 * auVar107._4_4_;
      bVar10 = (bool)(bVar62 >> 2 & 1);
      auVar114._8_4_ = (uint)bVar10 * auVar113._8_4_ | (uint)!bVar10 * auVar107._8_4_;
      bVar10 = (bool)(bVar62 >> 3 & 1);
      auVar114._12_4_ = (uint)bVar10 * auVar113._12_4_ | (uint)!bVar10 * auVar107._12_4_;
      bVar10 = (bool)(bVar62 >> 4 & 1);
      auVar114._16_4_ = (uint)bVar10 * auVar113._16_4_ | (uint)!bVar10 * auVar107._16_4_;
      bVar10 = (bool)(bVar62 >> 5 & 1);
      auVar114._20_4_ = (uint)bVar10 * auVar113._20_4_ | (uint)!bVar10 * auVar107._20_4_;
      bVar10 = (bool)(bVar62 >> 6 & 1);
      auVar114._24_4_ = (uint)bVar10 * auVar113._24_4_ | (uint)!bVar10 * auVar107._24_4_;
      auVar114._28_4_ =
           (uint)(bVar62 >> 7) * auVar113._28_4_ | (uint)!(bool)(bVar62 >> 7) * auVar107._28_4_;
      auVar94 = vmaxps_avx(auVar94,auVar114);
      uVar19 = vcmpps_avx512vl(auVar90,auVar110,6);
      bVar62 = (byte)uVar18 | (byte)uVar19;
      auVar115._0_4_ = (uint)(bVar62 & 1) * 0x7f800000 | (uint)!(bool)(bVar62 & 1) * auVar89._0_4_;
      bVar10 = (bool)(bVar62 >> 1 & 1);
      auVar115._4_4_ = (uint)bVar10 * 0x7f800000 | (uint)!bVar10 * auVar89._4_4_;
      bVar10 = (bool)(bVar62 >> 2 & 1);
      auVar115._8_4_ = (uint)bVar10 * 0x7f800000 | (uint)!bVar10 * auVar89._8_4_;
      bVar10 = (bool)(bVar62 >> 3 & 1);
      auVar115._12_4_ = (uint)bVar10 * 0x7f800000 | (uint)!bVar10 * auVar89._12_4_;
      bVar10 = (bool)(bVar62 >> 4 & 1);
      auVar115._16_4_ = (uint)bVar10 * 0x7f800000 | (uint)!bVar10 * auVar89._16_4_;
      bVar10 = (bool)(bVar62 >> 5 & 1);
      auVar115._20_4_ = (uint)bVar10 * 0x7f800000 | (uint)!bVar10 * auVar89._20_4_;
      bVar10 = (bool)(bVar62 >> 6 & 1);
      auVar115._24_4_ = (uint)bVar10 * 0x7f800000 | (uint)!bVar10 * auVar89._24_4_;
      auVar115._28_4_ =
           (uint)(bVar62 >> 7) * 0x7f800000 | (uint)!(bool)(bVar62 >> 7) * auVar89._28_4_;
      auVar89 = vminps_avx(auVar103,auVar115);
      auVar75 = vxorps_avx512vl(auVar110._0_16_,auVar110._0_16_);
      auVar90 = vsubps_avx512vl(ZEXT1632(auVar75),auVar95);
      auVar95 = vsubps_avx512vl(ZEXT1632(auVar75),auVar96);
      auVar96 = vsubps_avx512vl(ZEXT1632(auVar75),auVar97);
      auVar96 = vmulps_avx512vl(auVar96,auVar100);
      auVar95 = vfnmsub231ps_avx512vl(auVar96,auVar99,auVar95);
      auVar90 = vfnmadd231ps_avx512vl(auVar95,auVar98,auVar90);
      auVar95 = vmulps_avx512vl(auVar54,auVar100);
      auVar95 = vfnmsub231ps_avx512vl(auVar95,local_540,auVar99);
      auVar95 = vfnmadd231ps_avx512vl(auVar95,local_520,auVar98);
      vandps_avx512vl(auVar95,auVar102);
      uVar18 = vcmpps_avx512vl(auVar95,auVar108,1);
      auVar90 = vxorps_avx512vl(auVar90,auVar106);
      auVar96 = vrcp14ps_avx512vl(auVar95);
      auVar102 = vxorps_avx512vl(auVar95,auVar106);
      auVar103 = vfnmadd213ps_avx512vl(auVar96,auVar95,auVar111);
      auVar76 = vfmadd132ps_fma(auVar103,auVar96,auVar96);
      fVar214 = auVar76._0_4_ * auVar90._0_4_;
      fVar222 = auVar76._4_4_ * auVar90._4_4_;
      auVar43._4_4_ = fVar222;
      auVar43._0_4_ = fVar214;
      fVar223 = auVar76._8_4_ * auVar90._8_4_;
      auVar43._8_4_ = fVar223;
      fVar224 = auVar76._12_4_ * auVar90._12_4_;
      auVar43._12_4_ = fVar224;
      fVar241 = auVar90._16_4_ * 0.0;
      auVar43._16_4_ = fVar241;
      fVar225 = auVar90._20_4_ * 0.0;
      auVar43._20_4_ = fVar225;
      fVar226 = auVar90._24_4_ * 0.0;
      auVar43._24_4_ = fVar226;
      auVar43._28_4_ = auVar90._28_4_;
      uVar19 = vcmpps_avx512vl(auVar95,auVar102,1);
      bVar62 = (byte)uVar18 | (byte)uVar19;
      auVar103 = vblendmps_avx512vl(auVar43,auVar112);
      auVar116._0_4_ =
           (uint)(bVar62 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar62 & 1) * auVar96._0_4_;
      bVar10 = (bool)(bVar62 >> 1 & 1);
      auVar116._4_4_ = (uint)bVar10 * auVar103._4_4_ | (uint)!bVar10 * auVar96._4_4_;
      bVar10 = (bool)(bVar62 >> 2 & 1);
      auVar116._8_4_ = (uint)bVar10 * auVar103._8_4_ | (uint)!bVar10 * auVar96._8_4_;
      bVar10 = (bool)(bVar62 >> 3 & 1);
      auVar116._12_4_ = (uint)bVar10 * auVar103._12_4_ | (uint)!bVar10 * auVar96._12_4_;
      bVar10 = (bool)(bVar62 >> 4 & 1);
      auVar116._16_4_ = (uint)bVar10 * auVar103._16_4_ | (uint)!bVar10 * auVar96._16_4_;
      bVar10 = (bool)(bVar62 >> 5 & 1);
      auVar116._20_4_ = (uint)bVar10 * auVar103._20_4_ | (uint)!bVar10 * auVar96._20_4_;
      bVar10 = (bool)(bVar62 >> 6 & 1);
      auVar116._24_4_ = (uint)bVar10 * auVar103._24_4_ | (uint)!bVar10 * auVar96._24_4_;
      auVar116._28_4_ =
           (uint)(bVar62 >> 7) * auVar103._28_4_ | (uint)!(bool)(bVar62 >> 7) * auVar96._28_4_;
      _local_5a0 = vmaxps_avx(auVar94,auVar116);
      uVar19 = vcmpps_avx512vl(auVar95,auVar102,6);
      bVar62 = (byte)uVar18 | (byte)uVar19;
      auVar94._0_4_ = (uint)(bVar62 & 1) * 0x7f800000 | (uint)!(bool)(bVar62 & 1) * (int)fVar214;
      bVar10 = (bool)(bVar62 >> 1 & 1);
      auVar94._4_4_ = (uint)bVar10 * 0x7f800000 | (uint)!bVar10 * (int)fVar222;
      bVar10 = (bool)(bVar62 >> 2 & 1);
      auVar94._8_4_ = (uint)bVar10 * 0x7f800000 | (uint)!bVar10 * (int)fVar223;
      bVar10 = (bool)(bVar62 >> 3 & 1);
      auVar94._12_4_ = (uint)bVar10 * 0x7f800000 | (uint)!bVar10 * (int)fVar224;
      bVar10 = (bool)(bVar62 >> 4 & 1);
      auVar94._16_4_ = (uint)bVar10 * 0x7f800000 | (uint)!bVar10 * (int)fVar241;
      bVar10 = (bool)(bVar62 >> 5 & 1);
      auVar94._20_4_ = (uint)bVar10 * 0x7f800000 | (uint)!bVar10 * (int)fVar225;
      bVar10 = (bool)(bVar62 >> 6 & 1);
      auVar94._24_4_ = (uint)bVar10 * 0x7f800000 | (uint)!bVar10 * (int)fVar226;
      auVar94._28_4_ =
           (uint)(bVar62 >> 7) * 0x7f800000 | (uint)!(bool)(bVar62 >> 7) * auVar90._28_4_;
      local_3e0 = vminps_avx(auVar89,auVar94);
      auVar237 = ZEXT3264(local_3e0);
      auVar89 = _local_5a0;
      uVar18 = vcmpps_avx512vl(_local_5a0,local_3e0,2);
      bVar58 = bVar58 & 0x7f & (byte)uVar18;
      if (bVar58 == 0) goto LAB_01bf5b82;
      auVar90 = vmaxps_avx512vl(ZEXT1632(auVar75),local_740);
      auVar94 = vminps_avx512vl(local_4c0,auVar111);
      auVar51 = ZEXT412(0);
      auVar95 = ZEXT1232(auVar51) << 0x20;
      auVar94 = vmaxps_avx(auVar94,ZEXT1232(auVar51) << 0x20);
      auVar96 = vminps_avx512vl(local_4e0,auVar111);
      auVar44._4_4_ = (auVar94._4_4_ + 1.0) * 0.125;
      auVar44._0_4_ = (auVar94._0_4_ + 0.0) * 0.125;
      auVar44._8_4_ = (auVar94._8_4_ + 2.0) * 0.125;
      auVar44._12_4_ = (auVar94._12_4_ + 3.0) * 0.125;
      auVar44._16_4_ = (auVar94._16_4_ + 4.0) * 0.125;
      auVar44._20_4_ = (auVar94._20_4_ + 5.0) * 0.125;
      auVar44._24_4_ = (auVar94._24_4_ + 6.0) * 0.125;
      auVar44._28_4_ = auVar94._28_4_ + 7.0;
      local_4c0 = vfmadd213ps_avx512vl(auVar44,local_720,local_880);
      auVar94 = vmaxps_avx(auVar96,ZEXT1232(auVar51) << 0x20);
      auVar45._4_4_ = (auVar94._4_4_ + 1.0) * 0.125;
      auVar45._0_4_ = (auVar94._0_4_ + 0.0) * 0.125;
      auVar45._8_4_ = (auVar94._8_4_ + 2.0) * 0.125;
      auVar45._12_4_ = (auVar94._12_4_ + 3.0) * 0.125;
      auVar45._16_4_ = (auVar94._16_4_ + 4.0) * 0.125;
      auVar45._20_4_ = (auVar94._20_4_ + 5.0) * 0.125;
      auVar45._24_4_ = (auVar94._24_4_ + 6.0) * 0.125;
      auVar45._28_4_ = auVar94._28_4_ + 7.0;
      local_4e0 = vfmadd213ps_avx512vl(auVar45,local_720,local_880);
      auVar46._4_4_ = auVar90._4_4_ * auVar90._4_4_;
      auVar46._0_4_ = auVar90._0_4_ * auVar90._0_4_;
      auVar46._8_4_ = auVar90._8_4_ * auVar90._8_4_;
      auVar46._12_4_ = auVar90._12_4_ * auVar90._12_4_;
      auVar46._16_4_ = auVar90._16_4_ * auVar90._16_4_;
      auVar46._20_4_ = auVar90._20_4_ * auVar90._20_4_;
      auVar46._24_4_ = auVar90._24_4_ * auVar90._24_4_;
      auVar46._28_4_ = local_4e0._28_4_;
      auVar90 = vsubps_avx(local_840,auVar46);
      auVar94 = vmulps_avx512vl(auVar101,auVar90);
      auVar101 = vsubps_avx(local_820,auVar94);
      uVar18 = vcmpps_avx512vl(auVar101,ZEXT1232(auVar51) << 0x20,5);
      bVar62 = (byte)uVar18;
      auVar96 = ZEXT1232(ZEXT812(0)) << 0x20;
      if (bVar62 == 0) {
        auVar83 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar243 = ZEXT864(0) << 0x20;
        auVar101 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar238 = SUB6428(ZEXT864(0),0) << 0x20;
        auVar117._8_4_ = 0x7f800000;
        auVar117._0_8_ = 0x7f8000007f800000;
        auVar117._12_4_ = 0x7f800000;
        auVar117._16_4_ = 0x7f800000;
        auVar117._20_4_ = 0x7f800000;
        auVar117._24_4_ = 0x7f800000;
        auVar117._28_4_ = 0x7f800000;
        auVar118._8_4_ = 0xff800000;
        auVar118._0_8_ = 0xff800000ff800000;
        auVar118._12_4_ = 0xff800000;
        auVar118._16_4_ = 0xff800000;
        auVar118._20_4_ = 0xff800000;
        auVar118._24_4_ = 0xff800000;
        auVar118._28_4_ = 0xff800000;
      }
      else {
        auVar75 = vxorps_avx512vl(auVar99._0_16_,auVar99._0_16_);
        uVar66 = vcmpps_avx512vl(auVar101,ZEXT1232(ZEXT812(0)) << 0x20,5);
        auVar94 = vsqrtps_avx(auVar101);
        auVar168._0_4_ = auVar88._0_4_ + auVar88._0_4_;
        auVar168._4_4_ = auVar88._4_4_ + auVar88._4_4_;
        auVar168._8_4_ = auVar88._8_4_ + auVar88._8_4_;
        auVar168._12_4_ = auVar88._12_4_ + auVar88._12_4_;
        auVar168._16_4_ = auVar88._16_4_ + auVar88._16_4_;
        auVar168._20_4_ = auVar88._20_4_ + auVar88._20_4_;
        auVar168._24_4_ = auVar88._24_4_ + auVar88._24_4_;
        auVar168._28_4_ = auVar88._28_4_ + auVar88._28_4_;
        auVar101 = vrcp14ps_avx512vl(auVar168);
        auVar95 = vfnmadd213ps_avx512vl(auVar168,auVar101,auVar111);
        auVar76 = vfmadd132ps_fma(auVar95,auVar101,auVar101);
        auVar36._8_4_ = 0x80000000;
        auVar36._0_8_ = 0x8000000080000000;
        auVar36._12_4_ = 0x80000000;
        auVar36._16_4_ = 0x80000000;
        auVar36._20_4_ = 0x80000000;
        auVar36._24_4_ = 0x80000000;
        auVar36._28_4_ = 0x80000000;
        auVar101 = vxorps_avx512vl(auVar104,auVar36);
        auVar101 = vsubps_avx(auVar101,auVar94);
        auVar47._4_4_ = auVar101._4_4_ * auVar76._4_4_;
        auVar47._0_4_ = auVar101._0_4_ * auVar76._0_4_;
        auVar47._8_4_ = auVar101._8_4_ * auVar76._8_4_;
        auVar47._12_4_ = auVar101._12_4_ * auVar76._12_4_;
        auVar47._16_4_ = auVar101._16_4_ * 0.0;
        auVar47._20_4_ = auVar101._20_4_ * 0.0;
        auVar47._24_4_ = auVar101._24_4_ * 0.0;
        auVar47._28_4_ = 0x3e000000;
        auVar94 = vsubps_avx512vl(auVar94,auVar104);
        auVar48._4_4_ = auVar94._4_4_ * auVar76._4_4_;
        auVar48._0_4_ = auVar94._0_4_ * auVar76._0_4_;
        auVar48._8_4_ = auVar94._8_4_ * auVar76._8_4_;
        auVar48._12_4_ = auVar94._12_4_ * auVar76._12_4_;
        auVar48._16_4_ = auVar94._16_4_ * 0.0;
        auVar48._20_4_ = auVar94._20_4_ * 0.0;
        auVar48._24_4_ = auVar94._24_4_ * 0.0;
        auVar48._28_4_ = fVar127;
        auVar94 = vfmadd213ps_avx512vl(auVar105,auVar47,auVar83);
        auVar49._4_4_ = auVar87._4_4_ * auVar94._4_4_;
        auVar49._0_4_ = auVar87._0_4_ * auVar94._0_4_;
        auVar49._8_4_ = auVar87._8_4_ * auVar94._8_4_;
        auVar49._12_4_ = auVar87._12_4_ * auVar94._12_4_;
        auVar49._16_4_ = auVar87._16_4_ * auVar94._16_4_;
        auVar49._20_4_ = auVar87._20_4_ * auVar94._20_4_;
        auVar49._24_4_ = auVar87._24_4_ * auVar94._24_4_;
        auVar49._28_4_ = auVar101._28_4_;
        auVar94 = vmulps_avx512vl(local_520,auVar47);
        auVar95 = vmulps_avx512vl(local_540,auVar47);
        auVar55._4_4_ = uStack_55c;
        auVar55._0_4_ = local_560;
        auVar55._8_4_ = uStack_558;
        auVar55._12_4_ = uStack_554;
        auVar55._16_4_ = uStack_550;
        auVar55._20_4_ = uStack_54c;
        auVar55._24_4_ = uStack_548;
        auVar55._28_4_ = uStack_544;
        auVar102 = vmulps_avx512vl(auVar55,auVar47);
        auVar101 = vfmadd213ps_avx512vl(auVar84,auVar49,auVar91);
        auVar101 = vsubps_avx512vl(auVar94,auVar101);
        auVar94 = vfmadd213ps_avx512vl(auVar85,auVar49,auVar92);
        auVar96 = vsubps_avx512vl(auVar95,auVar94);
        auVar76 = vfmadd213ps_fma(auVar49,auVar86,auVar93);
        auVar94 = vsubps_avx(auVar102,ZEXT1632(auVar76));
        auVar238 = auVar94._0_28_;
        auVar94 = vfmadd213ps_avx512vl(auVar105,auVar48,auVar83);
        auVar94 = vmulps_avx512vl(auVar87,auVar94);
        auVar83 = vmulps_avx512vl(local_520,auVar48);
        auVar87 = vmulps_avx512vl(local_540,auVar48);
        auVar102 = vmulps_avx512vl(auVar55,auVar48);
        auVar76 = vfmadd213ps_fma(auVar84,auVar94,auVar91);
        auVar95 = vsubps_avx(auVar83,ZEXT1632(auVar76));
        auVar76 = vfmadd213ps_fma(auVar85,auVar94,auVar92);
        auVar83 = vsubps_avx512vl(auVar87,ZEXT1632(auVar76));
        auVar76 = vfmadd213ps_fma(auVar86,auVar94,auVar93);
        auVar94 = vsubps_avx512vl(auVar102,ZEXT1632(auVar76));
        auVar243 = ZEXT3264(auVar94);
        auVar186._8_4_ = 0x7f800000;
        auVar186._0_8_ = 0x7f8000007f800000;
        auVar186._12_4_ = 0x7f800000;
        auVar186._16_4_ = 0x7f800000;
        auVar186._20_4_ = 0x7f800000;
        auVar186._24_4_ = 0x7f800000;
        auVar186._28_4_ = 0x7f800000;
        auVar94 = vblendmps_avx512vl(auVar186,auVar47);
        bVar10 = (bool)((byte)uVar66 & 1);
        auVar117._0_4_ = (uint)bVar10 * auVar94._0_4_ | (uint)!bVar10 * auVar91._0_4_;
        bVar10 = (bool)((byte)(uVar66 >> 1) & 1);
        auVar117._4_4_ = (uint)bVar10 * auVar94._4_4_ | (uint)!bVar10 * auVar91._4_4_;
        bVar10 = (bool)((byte)(uVar66 >> 2) & 1);
        auVar117._8_4_ = (uint)bVar10 * auVar94._8_4_ | (uint)!bVar10 * auVar91._8_4_;
        bVar10 = (bool)((byte)(uVar66 >> 3) & 1);
        auVar117._12_4_ = (uint)bVar10 * auVar94._12_4_ | (uint)!bVar10 * auVar91._12_4_;
        bVar10 = (bool)((byte)(uVar66 >> 4) & 1);
        auVar117._16_4_ = (uint)bVar10 * auVar94._16_4_ | (uint)!bVar10 * auVar91._16_4_;
        bVar10 = (bool)((byte)(uVar66 >> 5) & 1);
        auVar117._20_4_ = (uint)bVar10 * auVar94._20_4_ | (uint)!bVar10 * auVar91._20_4_;
        bVar10 = (bool)((byte)(uVar66 >> 6) & 1);
        auVar117._24_4_ = (uint)bVar10 * auVar94._24_4_ | (uint)!bVar10 * auVar91._24_4_;
        bVar10 = SUB81(uVar66 >> 7,0);
        auVar117._28_4_ = (uint)bVar10 * auVar94._28_4_ | (uint)!bVar10 * auVar91._28_4_;
        auVar187._8_4_ = 0xff800000;
        auVar187._0_8_ = 0xff800000ff800000;
        auVar187._12_4_ = 0xff800000;
        auVar187._16_4_ = 0xff800000;
        auVar187._20_4_ = 0xff800000;
        auVar187._24_4_ = 0xff800000;
        auVar187._28_4_ = 0xff800000;
        auVar94 = vblendmps_avx512vl(auVar187,auVar48);
        bVar10 = (bool)((byte)uVar66 & 1);
        auVar118._0_4_ = (uint)bVar10 * auVar94._0_4_ | (uint)!bVar10 * -0x800000;
        bVar10 = (bool)((byte)(uVar66 >> 1) & 1);
        auVar118._4_4_ = (uint)bVar10 * auVar94._4_4_ | (uint)!bVar10 * -0x800000;
        bVar10 = (bool)((byte)(uVar66 >> 2) & 1);
        auVar118._8_4_ = (uint)bVar10 * auVar94._8_4_ | (uint)!bVar10 * -0x800000;
        bVar10 = (bool)((byte)(uVar66 >> 3) & 1);
        auVar118._12_4_ = (uint)bVar10 * auVar94._12_4_ | (uint)!bVar10 * -0x800000;
        bVar10 = (bool)((byte)(uVar66 >> 4) & 1);
        auVar118._16_4_ = (uint)bVar10 * auVar94._16_4_ | (uint)!bVar10 * -0x800000;
        bVar10 = (bool)((byte)(uVar66 >> 5) & 1);
        auVar118._20_4_ = (uint)bVar10 * auVar94._20_4_ | (uint)!bVar10 * -0x800000;
        bVar10 = (bool)((byte)(uVar66 >> 6) & 1);
        auVar118._24_4_ = (uint)bVar10 * auVar94._24_4_ | (uint)!bVar10 * -0x800000;
        bVar10 = SUB81(uVar66 >> 7,0);
        auVar118._28_4_ = (uint)bVar10 * auVar94._28_4_ | (uint)!bVar10 * -0x800000;
        auVar231._8_4_ = 0x7fffffff;
        auVar231._0_8_ = 0x7fffffff7fffffff;
        auVar231._12_4_ = 0x7fffffff;
        auVar231._16_4_ = 0x7fffffff;
        auVar231._20_4_ = 0x7fffffff;
        auVar231._24_4_ = 0x7fffffff;
        auVar231._28_4_ = 0x7fffffff;
        auVar94 = vandps_avx(auVar231,local_6e0);
        auVar94 = vmaxps_avx(local_460,auVar94);
        auVar37._8_4_ = 0x36000000;
        auVar37._0_8_ = 0x3600000036000000;
        auVar37._12_4_ = 0x36000000;
        auVar37._16_4_ = 0x36000000;
        auVar37._20_4_ = 0x36000000;
        auVar37._24_4_ = 0x36000000;
        auVar37._28_4_ = 0x36000000;
        auVar94 = vmulps_avx512vl(auVar94,auVar37);
        auVar84 = vandps_avx(auVar88,auVar231);
        uVar60 = vcmpps_avx512vl(auVar84,auVar94,1);
        uVar66 = uVar66 & uVar60;
        bVar61 = (byte)uVar66;
        if (bVar61 != 0) {
          uVar60 = vcmpps_avx512vl(auVar90,ZEXT1632(auVar75),2);
          auVar232._8_4_ = 0xff800000;
          auVar232._0_8_ = 0xff800000ff800000;
          auVar232._12_4_ = 0xff800000;
          auVar232._16_4_ = 0xff800000;
          auVar232._20_4_ = 0xff800000;
          auVar232._24_4_ = 0xff800000;
          auVar232._28_4_ = 0xff800000;
          auVar247._8_4_ = 0x7f800000;
          auVar247._0_8_ = 0x7f8000007f800000;
          auVar247._12_4_ = 0x7f800000;
          auVar247._16_4_ = 0x7f800000;
          auVar247._20_4_ = 0x7f800000;
          auVar247._24_4_ = 0x7f800000;
          auVar247._28_4_ = 0x7f800000;
          auVar84 = vblendmps_avx512vl(auVar247,auVar232);
          bVar59 = (byte)uVar60;
          uVar67 = (uint)(bVar59 & 1) * auVar84._0_4_ | (uint)!(bool)(bVar59 & 1) * auVar94._0_4_;
          bVar10 = (bool)((byte)(uVar60 >> 1) & 1);
          uVar120 = (uint)bVar10 * auVar84._4_4_ | (uint)!bVar10 * auVar94._4_4_;
          bVar10 = (bool)((byte)(uVar60 >> 2) & 1);
          uVar121 = (uint)bVar10 * auVar84._8_4_ | (uint)!bVar10 * auVar94._8_4_;
          bVar10 = (bool)((byte)(uVar60 >> 3) & 1);
          uVar122 = (uint)bVar10 * auVar84._12_4_ | (uint)!bVar10 * auVar94._12_4_;
          bVar10 = (bool)((byte)(uVar60 >> 4) & 1);
          uVar123 = (uint)bVar10 * auVar84._16_4_ | (uint)!bVar10 * auVar94._16_4_;
          bVar10 = (bool)((byte)(uVar60 >> 5) & 1);
          uVar124 = (uint)bVar10 * auVar84._20_4_ | (uint)!bVar10 * auVar94._20_4_;
          bVar10 = (bool)((byte)(uVar60 >> 6) & 1);
          uVar125 = (uint)bVar10 * auVar84._24_4_ | (uint)!bVar10 * auVar94._24_4_;
          bVar10 = SUB81(uVar60 >> 7,0);
          uVar126 = (uint)bVar10 * auVar84._28_4_ | (uint)!bVar10 * auVar94._28_4_;
          auVar117._0_4_ = (bVar61 & 1) * uVar67 | !(bool)(bVar61 & 1) * auVar117._0_4_;
          bVar10 = (bool)((byte)(uVar66 >> 1) & 1);
          auVar117._4_4_ = bVar10 * uVar120 | !bVar10 * auVar117._4_4_;
          bVar10 = (bool)((byte)(uVar66 >> 2) & 1);
          auVar117._8_4_ = bVar10 * uVar121 | !bVar10 * auVar117._8_4_;
          bVar10 = (bool)((byte)(uVar66 >> 3) & 1);
          auVar117._12_4_ = bVar10 * uVar122 | !bVar10 * auVar117._12_4_;
          bVar10 = (bool)((byte)(uVar66 >> 4) & 1);
          auVar117._16_4_ = bVar10 * uVar123 | !bVar10 * auVar117._16_4_;
          bVar10 = (bool)((byte)(uVar66 >> 5) & 1);
          auVar117._20_4_ = bVar10 * uVar124 | !bVar10 * auVar117._20_4_;
          bVar10 = (bool)((byte)(uVar66 >> 6) & 1);
          auVar117._24_4_ = bVar10 * uVar125 | !bVar10 * auVar117._24_4_;
          bVar10 = SUB81(uVar66 >> 7,0);
          auVar117._28_4_ = bVar10 * uVar126 | !bVar10 * auVar117._28_4_;
          auVar84 = vblendmps_avx512vl(auVar232,auVar247);
          bVar10 = (bool)((byte)(uVar60 >> 1) & 1);
          bVar11 = (bool)((byte)(uVar60 >> 2) & 1);
          bVar12 = (bool)((byte)(uVar60 >> 3) & 1);
          bVar13 = (bool)((byte)(uVar60 >> 4) & 1);
          bVar14 = (bool)((byte)(uVar60 >> 5) & 1);
          bVar15 = (bool)((byte)(uVar60 >> 6) & 1);
          bVar16 = SUB81(uVar60 >> 7,0);
          auVar94._0_4_ =
               (uint)(bVar61 & 1) *
               ((uint)(bVar59 & 1) * auVar84._0_4_ | !(bool)(bVar59 & 1) * uVar67) |
               !(bool)(bVar61 & 1) * auVar118._0_4_;
          bVar65 = (bool)((byte)(uVar66 >> 1) & 1);
          auVar94._4_4_ =
               (uint)bVar65 * ((uint)bVar10 * auVar84._4_4_ | !bVar10 * uVar120) |
               !bVar65 * auVar118._4_4_;
          bVar10 = (bool)((byte)(uVar66 >> 2) & 1);
          auVar94._8_4_ =
               (uint)bVar10 * ((uint)bVar11 * auVar84._8_4_ | !bVar11 * uVar121) |
               !bVar10 * auVar118._8_4_;
          bVar10 = (bool)((byte)(uVar66 >> 3) & 1);
          auVar94._12_4_ =
               (uint)bVar10 * ((uint)bVar12 * auVar84._12_4_ | !bVar12 * uVar122) |
               !bVar10 * auVar118._12_4_;
          bVar10 = (bool)((byte)(uVar66 >> 4) & 1);
          auVar94._16_4_ =
               (uint)bVar10 * ((uint)bVar13 * auVar84._16_4_ | !bVar13 * uVar123) |
               !bVar10 * auVar118._16_4_;
          bVar10 = (bool)((byte)(uVar66 >> 5) & 1);
          auVar94._20_4_ =
               (uint)bVar10 * ((uint)bVar14 * auVar84._20_4_ | !bVar14 * uVar124) |
               !bVar10 * auVar118._20_4_;
          bVar10 = (bool)((byte)(uVar66 >> 6) & 1);
          auVar94._24_4_ =
               (uint)bVar10 * ((uint)bVar15 * auVar84._24_4_ | !bVar15 * uVar125) |
               !bVar10 * auVar118._24_4_;
          bVar10 = SUB81(uVar66 >> 7,0);
          auVar94._28_4_ =
               (uint)bVar10 * ((uint)bVar16 * auVar84._28_4_ | !bVar16 * uVar126) |
               !bVar10 * auVar118._28_4_;
          bVar62 = (~bVar61 | bVar59) & bVar62;
          auVar118 = auVar94;
        }
      }
      auVar248._8_4_ = 0x7fffffff;
      auVar248._0_8_ = 0x7fffffff7fffffff;
      auVar248._12_4_ = 0x7fffffff;
      auVar249 = ZEXT1664(ZEXT816(0) << 0x40);
      uVar206 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
      auVar221._4_4_ = uVar206;
      auVar221._0_4_ = uVar206;
      auVar221._8_4_ = uVar206;
      auVar221._12_4_ = uVar206;
      auVar221._16_4_ = uVar206;
      auVar221._20_4_ = uVar206;
      auVar221._24_4_ = uVar206;
      auVar221._28_4_ = uVar206;
      uVar206 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
      auVar233._4_4_ = uVar206;
      auVar233._0_4_ = uVar206;
      auVar233._8_4_ = uVar206;
      auVar233._12_4_ = uVar206;
      auVar233._16_4_ = uVar206;
      auVar233._20_4_ = uVar206;
      auVar233._24_4_ = uVar206;
      auVar233._28_4_ = uVar206;
      fVar214 = (ray->super_RayK<1>).dir.field_0.m128[2];
      auVar205._0_4_ = fVar214 * auVar243._0_4_;
      auVar205._4_4_ = fVar214 * auVar243._4_4_;
      auVar205._8_4_ = fVar214 * auVar243._8_4_;
      auVar205._12_4_ = fVar214 * auVar243._12_4_;
      auVar205._16_4_ = fVar214 * auVar243._16_4_;
      auVar205._20_4_ = fVar214 * auVar243._20_4_;
      auVar205._28_36_ = auVar243._28_36_;
      auVar205._24_4_ = fVar214 * auVar243._24_4_;
      auVar76 = vfmadd231ps_fma(auVar205._0_32_,auVar233,auVar83);
      auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),auVar221,auVar95);
      _local_440 = _local_5a0;
      local_420 = vminps_avx(local_3e0,auVar117);
      auVar242._8_4_ = 0x7fffffff;
      auVar242._0_8_ = 0x7fffffff7fffffff;
      auVar242._12_4_ = 0x7fffffff;
      auVar242._16_4_ = 0x7fffffff;
      auVar242._20_4_ = 0x7fffffff;
      auVar242._24_4_ = 0x7fffffff;
      auVar242._28_4_ = 0x7fffffff;
      auVar83 = vandps_avx(auVar242,ZEXT1632(auVar76));
      auVar205 = ZEXT3264(auVar83);
      _local_400 = vmaxps_avx(_local_5a0,auVar118);
      auVar189._8_4_ = 0x3e99999a;
      auVar189._0_8_ = 0x3e99999a3e99999a;
      auVar189._12_4_ = 0x3e99999a;
      auVar189._16_4_ = 0x3e99999a;
      auVar189._20_4_ = 0x3e99999a;
      auVar189._24_4_ = 0x3e99999a;
      auVar189._28_4_ = 0x3e99999a;
      uVar18 = vcmpps_avx512vl(auVar83,auVar189,1);
      local_794 = (int)uVar18;
      uVar18 = vcmpps_avx512vl(_local_5a0,local_420,2);
      bVar61 = (byte)uVar18 & bVar58;
      _local_580 = _local_400;
      uVar19 = vcmpps_avx512vl(_local_400,local_3e0,2);
      if ((bVar58 & ((byte)uVar19 | (byte)uVar18)) == 0) {
        auVar243 = ZEXT3264(_DAT_02020f20);
      }
      else {
        auVar50._4_4_ = auVar238._4_4_ * fVar214;
        auVar50._0_4_ = auVar238._0_4_ * fVar214;
        auVar50._8_4_ = auVar238._8_4_ * fVar214;
        auVar50._12_4_ = auVar238._12_4_ * fVar214;
        auVar50._16_4_ = auVar238._16_4_ * fVar214;
        auVar50._20_4_ = auVar238._20_4_ * fVar214;
        auVar50._24_4_ = auVar238._24_4_ * fVar214;
        auVar50._28_4_ = 0x3e99999a;
        auVar76 = vfmadd213ps_fma(auVar96,auVar233,auVar50);
        auVar76 = vfmadd213ps_fma(auVar101,auVar221,ZEXT1632(auVar76));
        auVar94 = vandps_avx(auVar242,ZEXT1632(auVar76));
        uVar18 = vcmpps_avx512vl(auVar94,auVar189,1);
        local_79c = (uint)(byte)~bVar62;
        bVar62 = (byte)uVar18 | ~bVar62;
        auVar142._8_4_ = 2;
        auVar142._0_8_ = 0x200000002;
        auVar142._12_4_ = 2;
        auVar142._16_4_ = 2;
        auVar142._20_4_ = 2;
        auVar142._24_4_ = 2;
        auVar142._28_4_ = 2;
        auVar38._8_4_ = 3;
        auVar38._0_8_ = 0x300000003;
        auVar38._12_4_ = 3;
        auVar38._16_4_ = 3;
        auVar38._20_4_ = 3;
        auVar38._24_4_ = 3;
        auVar38._28_4_ = 3;
        auVar94 = vpblendmd_avx512vl(auVar142,auVar38);
        local_3c0._0_4_ = (uint)(bVar62 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar62 & 1) * 2;
        bVar10 = (bool)(bVar62 >> 1 & 1);
        local_3c0._4_4_ = (uint)bVar10 * auVar94._4_4_ | (uint)!bVar10 * 2;
        bVar10 = (bool)(bVar62 >> 2 & 1);
        local_3c0._8_4_ = (uint)bVar10 * auVar94._8_4_ | (uint)!bVar10 * 2;
        bVar10 = (bool)(bVar62 >> 3 & 1);
        local_3c0._12_4_ = (uint)bVar10 * auVar94._12_4_ | (uint)!bVar10 * 2;
        bVar10 = (bool)(bVar62 >> 4 & 1);
        local_3c0._16_4_ = (uint)bVar10 * auVar94._16_4_ | (uint)!bVar10 * 2;
        bVar10 = (bool)(bVar62 >> 5 & 1);
        local_3c0._20_4_ = (uint)bVar10 * auVar94._20_4_ | (uint)!bVar10 * 2;
        bVar10 = (bool)(bVar62 >> 6 & 1);
        local_3c0._24_4_ = (uint)bVar10 * auVar94._24_4_ | (uint)!bVar10 * 2;
        local_3c0._28_4_ = (uint)(bVar62 >> 7) * auVar94._28_4_ | (uint)!(bool)(bVar62 >> 7) * 2;
        local_480 = vpbroadcastd_avx512vl();
        uVar18 = vpcmpd_avx512vl(local_480,local_3c0,5);
        local_798 = (uint)bVar61;
        bVar61 = (byte)uVar18 & bVar61;
        if (bVar61 != 0) {
          auVar75 = vminps_avx(local_5c0._0_16_,local_600._0_16_);
          auVar76 = vmaxps_avx(local_5c0._0_16_,local_600._0_16_);
          auVar69 = vminps_avx(local_5e0._0_16_,local_620._0_16_);
          auVar77 = vminps_avx(auVar75,auVar69);
          auVar75 = vmaxps_avx(local_5e0._0_16_,local_620._0_16_);
          auVar69 = vmaxps_avx(auVar76,auVar75);
          auVar76 = vandps_avx(auVar248,auVar77);
          auVar75 = vandps_avx(auVar248,auVar69);
          auVar76 = vmaxps_avx(auVar76,auVar75);
          auVar75 = vmovshdup_avx(auVar76);
          auVar75 = vmaxss_avx(auVar75,auVar76);
          auVar76 = vshufpd_avx(auVar76,auVar76,1);
          auVar76 = vmaxss_avx(auVar76,auVar75);
          fVar214 = auVar76._0_4_ * 1.9073486e-06;
          local_6b0 = vshufps_avx(auVar69,auVar69,0xff);
          local_500 = (float)local_5a0._0_4_ + (float)local_700._0_4_;
          fStack_4fc = (float)local_5a0._4_4_ + (float)local_700._4_4_;
          fStack_4f8 = fStack_598 + fStack_6f8;
          fStack_4f4 = fStack_594 + fStack_6f4;
          fStack_4f0 = fStack_590 + fStack_6f0;
          fStack_4ec = fStack_58c + fStack_6ec;
          fStack_4e8 = fStack_588 + fStack_6e8;
          fStack_4e4 = fStack_584 + fStack_6e4;
          _local_5a0 = auVar89;
          do {
            auVar84 = local_880;
            auVar143._8_4_ = 0x7f800000;
            auVar143._0_8_ = 0x7f8000007f800000;
            auVar143._12_4_ = 0x7f800000;
            auVar143._16_4_ = 0x7f800000;
            auVar143._20_4_ = 0x7f800000;
            auVar143._24_4_ = 0x7f800000;
            auVar143._28_4_ = 0x7f800000;
            auVar94 = vblendmps_avx512vl(auVar143,_local_5a0);
            auVar119._0_4_ =
                 (uint)(bVar61 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar61 & 1) * 0x7f800000;
            bVar10 = (bool)(bVar61 >> 1 & 1);
            auVar119._4_4_ = (uint)bVar10 * auVar94._4_4_ | (uint)!bVar10 * 0x7f800000;
            bVar10 = (bool)(bVar61 >> 2 & 1);
            auVar119._8_4_ = (uint)bVar10 * auVar94._8_4_ | (uint)!bVar10 * 0x7f800000;
            bVar10 = (bool)(bVar61 >> 3 & 1);
            auVar119._12_4_ = (uint)bVar10 * auVar94._12_4_ | (uint)!bVar10 * 0x7f800000;
            bVar10 = (bool)(bVar61 >> 4 & 1);
            auVar119._16_4_ = (uint)bVar10 * auVar94._16_4_ | (uint)!bVar10 * 0x7f800000;
            bVar10 = (bool)(bVar61 >> 5 & 1);
            auVar119._20_4_ = (uint)bVar10 * auVar94._20_4_ | (uint)!bVar10 * 0x7f800000;
            bVar10 = (bool)(bVar61 >> 6 & 1);
            auVar119._24_4_ = (uint)bVar10 * auVar94._24_4_ | (uint)!bVar10 * 0x7f800000;
            auVar119._28_4_ =
                 (uint)(bVar61 >> 7) * auVar94._28_4_ | (uint)!(bool)(bVar61 >> 7) * 0x7f800000;
            auVar94 = vshufps_avx(auVar119,auVar119,0xb1);
            auVar94 = vminps_avx(auVar119,auVar94);
            auVar83 = vshufpd_avx(auVar94,auVar94,5);
            auVar94 = vminps_avx(auVar94,auVar83);
            auVar83 = vpermpd_avx2(auVar94,0x4e);
            auVar94 = vminps_avx(auVar94,auVar83);
            uVar18 = vcmpps_avx512vl(auVar119,auVar94,0);
            bVar59 = (byte)uVar18 & bVar61;
            bVar62 = bVar61;
            if (bVar59 != 0) {
              bVar62 = bVar59;
            }
            iVar21 = 0;
            for (uVar67 = (uint)bVar62; (uVar67 & 1) == 0; uVar67 = uVar67 >> 1 | 0x80000000) {
              iVar21 = iVar21 + 1;
            }
            auVar237 = ZEXT464(*(uint *)(local_4c0 + (uint)(iVar21 << 2)));
            aVar2 = (ray->super_RayK<1>).dir.field_0;
            local_6e0._0_16_ = (undefined1  [16])aVar2;
            auVar76 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
            if (auVar76._0_4_ < 0.0) {
              local_820._0_16_ = ZEXT416(*(uint *)(local_4c0 + (uint)(iVar21 << 2)));
              local_840._0_16_ = ZEXT416((uint)*(float *)(local_440 + (uint)(iVar21 << 2)));
              local_880[1] = 0;
              local_880[0] = bVar61;
              local_880._2_30_ = auVar84._2_30_;
              fVar223 = sqrtf(auVar76._0_4_);
              bVar61 = local_880[0];
              auVar237 = ZEXT1664(local_820._0_16_);
              auVar249 = ZEXT1664(ZEXT816(0) << 0x40);
              fVar222 = (float)local_840._0_4_;
              uVar206 = local_840._4_4_;
              uVar239 = local_840._8_4_;
              uVar240 = local_840._12_4_;
            }
            else {
              auVar76 = vsqrtss_avx(auVar76,auVar76);
              fVar223 = auVar76._0_4_;
              fVar222 = *(float *)(local_440 + (uint)(iVar21 << 2));
              uVar206 = 0;
              uVar239 = 0;
              uVar240 = 0;
            }
            lVar64 = 4;
            do {
              auVar94 = local_840;
              auVar131._4_4_ = fVar222;
              auVar131._0_4_ = fVar222;
              auVar131._8_4_ = fVar222;
              auVar131._12_4_ = fVar222;
              auVar78 = auVar249._0_16_;
              auVar75 = vfmadd132ps_fma(auVar131,auVar78,local_6e0._0_16_);
              fVar241 = auVar237._0_4_;
              fVar224 = 1.0 - fVar241;
              auVar176._0_4_ = local_600._0_4_ * fVar241;
              auVar176._4_4_ = local_600._4_4_ * fVar241;
              auVar176._8_4_ = local_600._8_4_ * fVar241;
              auVar176._12_4_ = local_600._12_4_ * fVar241;
              local_650 = ZEXT416((uint)fVar224);
              auVar192._4_4_ = fVar224;
              auVar192._0_4_ = fVar224;
              auVar192._8_4_ = fVar224;
              auVar192._12_4_ = fVar224;
              auVar76 = vfmadd231ps_fma(auVar176,auVar192,local_5c0._0_16_);
              auVar199._0_4_ = local_5e0._0_4_ * fVar241;
              auVar199._4_4_ = local_5e0._4_4_ * fVar241;
              auVar199._8_4_ = local_5e0._8_4_ * fVar241;
              auVar199._12_4_ = local_5e0._12_4_ * fVar241;
              auVar69 = vfmadd231ps_fma(auVar199,auVar192,local_600._0_16_);
              auVar210._0_4_ = fVar241 * (float)local_620._0_4_;
              auVar210._4_4_ = fVar241 * (float)local_620._4_4_;
              auVar210._8_4_ = fVar241 * fStack_618;
              auVar210._12_4_ = fVar241 * fStack_614;
              auVar77 = vfmadd231ps_fma(auVar210,auVar192,local_5e0._0_16_);
              auVar217._0_4_ = fVar241 * auVar69._0_4_;
              auVar217._4_4_ = fVar241 * auVar69._4_4_;
              auVar217._8_4_ = fVar241 * auVar69._8_4_;
              auVar217._12_4_ = fVar241 * auVar69._12_4_;
              auVar76 = vfmadd231ps_fma(auVar217,auVar192,auVar76);
              auVar177._0_4_ = fVar241 * auVar77._0_4_;
              auVar177._4_4_ = fVar241 * auVar77._4_4_;
              auVar177._8_4_ = fVar241 * auVar77._8_4_;
              auVar177._12_4_ = fVar241 * auVar77._12_4_;
              auVar69 = vfmadd231ps_fma(auVar177,auVar192,auVar69);
              auVar200._0_4_ = fVar241 * auVar69._0_4_;
              auVar200._4_4_ = fVar241 * auVar69._4_4_;
              auVar200._8_4_ = fVar241 * auVar69._8_4_;
              auVar200._12_4_ = fVar241 * auVar69._12_4_;
              local_640 = vfmadd231ps_fma(auVar200,auVar76,auVar192);
              auVar76 = vsubps_avx(auVar69,auVar76);
              auVar27._8_4_ = 0x40400000;
              auVar27._0_8_ = 0x4040000040400000;
              auVar27._12_4_ = 0x40400000;
              auVar69 = vmulps_avx512vl(auVar76,auVar27);
              auVar76 = vsubps_avx(auVar75,local_640);
              local_720._0_16_ = auVar76;
              auVar76 = vdpps_avx(auVar76,auVar76,0x7f);
              local_880._0_16_ = auVar69;
              local_740._0_16_ = auVar76;
              local_820._0_16_ = auVar237._0_16_;
              local_840._4_4_ = uVar206;
              local_840._0_4_ = fVar222;
              local_840._8_4_ = uVar239;
              local_840._16_16_ = auVar94._16_16_;
              local_840._12_4_ = uVar240;
              if (auVar76._0_4_ < 0.0) {
                auVar237._0_4_ = sqrtf(auVar76._0_4_);
                auVar237._4_60_ = extraout_var;
                auVar78 = ZEXT816(0) << 0x40;
                auVar76 = auVar237._0_16_;
                auVar69 = local_880._0_16_;
              }
              else {
                auVar76 = vsqrtss_avx(auVar76,auVar76);
              }
              local_660 = vdpps_avx(auVar69,auVar69,0x7f);
              fVar224 = local_660._0_4_;
              auVar153._4_12_ = auVar78._4_12_;
              auVar153._0_4_ = fVar224;
              local_7f0 = vrsqrt14ss_avx512f(auVar78,auVar153);
              fVar222 = local_7f0._0_4_ * 1.5;
              local_670 = vrcp14ss_avx512f(auVar78,auVar153);
              auVar28._8_4_ = 0x80000000;
              auVar28._0_8_ = 0x8000000080000000;
              auVar28._12_4_ = 0x80000000;
              auVar77 = vxorps_avx512vl(local_660,auVar28);
              auVar75 = vfnmadd213ss_fma(local_670,local_660,ZEXT416(0x40000000));
              uVar67 = auVar76._0_4_;
              if (fVar224 < auVar77._0_4_) {
                local_800._0_4_ = fVar222;
                auVar147._0_4_ = sqrtf(fVar224);
                auVar147._4_60_ = extraout_var_00;
                auVar76 = ZEXT416(uVar67);
                auVar78 = ZEXT816(0) << 0x40;
                auVar77 = auVar147._0_16_;
                auVar69 = local_880._0_16_;
              }
              else {
                auVar77 = vsqrtss_avx512f(local_660,local_660);
                local_800._0_4_ = fVar222;
              }
              fVar222 = local_7f0._0_4_;
              fVar222 = (float)local_800._0_4_ + fVar224 * -0.5 * fVar222 * fVar222 * fVar222;
              local_800._0_4_ = auVar69._0_4_ * fVar222;
              local_800._4_4_ = auVar69._4_4_ * fVar222;
              local_800._8_4_ = auVar69._8_4_ * fVar222;
              local_800._12_4_ = auVar69._12_4_ * fVar222;
              local_7f0 = vdpps_avx(local_720._0_16_,local_800,0x7f);
              fVar241 = auVar76._0_4_;
              auVar132._0_4_ = local_7f0._0_4_ * local_7f0._0_4_;
              auVar132._4_4_ = local_7f0._4_4_ * local_7f0._4_4_;
              auVar132._8_4_ = local_7f0._8_4_ * local_7f0._8_4_;
              auVar132._12_4_ = local_7f0._12_4_ * local_7f0._12_4_;
              auVar70 = vsubps_avx(local_740._0_16_,auVar132);
              fVar224 = auVar70._0_4_;
              auVar154._4_12_ = auVar78._4_12_;
              auVar154._0_4_ = fVar224;
              auVar78 = vrsqrt14ss_avx512f(auVar78,auVar154);
              auVar79 = vmulss_avx512f(auVar78,ZEXT416(0x3fc00000));
              auVar80 = vmulss_avx512f(auVar70,ZEXT416(0xbf000000));
              if (fVar224 < 0.0) {
                local_690 = fVar222;
                fStack_68c = fVar222;
                fStack_688 = fVar222;
                fStack_684 = fVar222;
                local_680 = auVar78;
                fVar224 = sqrtf(fVar224);
                auVar80 = ZEXT416(auVar80._0_4_);
                auVar79 = ZEXT416(auVar79._0_4_);
                auVar77 = ZEXT416(auVar77._0_4_);
                auVar76 = ZEXT416(uVar67);
                auVar69 = local_880._0_16_;
                auVar78 = local_680;
                fVar222 = local_690;
                fVar127 = fStack_68c;
                fVar225 = fStack_688;
                fVar226 = fStack_684;
              }
              else {
                auVar70 = vsqrtss_avx(auVar70,auVar70);
                fVar224 = auVar70._0_4_;
                fVar127 = fVar222;
                fVar225 = fVar222;
                fVar226 = fVar222;
              }
              auVar248._8_4_ = 0x7fffffff;
              auVar248._0_8_ = 0x7fffffff7fffffff;
              auVar248._12_4_ = 0x7fffffff;
              auVar70 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_820._0_16_,local_650);
              fVar227 = auVar70._0_4_ * 6.0;
              fVar17 = local_820._0_4_ * 6.0;
              auVar178._0_4_ = fVar17 * (float)local_620._0_4_;
              auVar178._4_4_ = fVar17 * (float)local_620._4_4_;
              auVar178._8_4_ = fVar17 * fStack_618;
              auVar178._12_4_ = fVar17 * fStack_614;
              auVar155._4_4_ = fVar227;
              auVar155._0_4_ = fVar227;
              auVar155._8_4_ = fVar227;
              auVar155._12_4_ = fVar227;
              auVar70 = vfmadd132ps_fma(auVar155,auVar178,local_5e0._0_16_);
              auVar71 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_650,local_820._0_16_);
              fVar227 = auVar71._0_4_ * 6.0;
              auVar179._4_4_ = fVar227;
              auVar179._0_4_ = fVar227;
              auVar179._8_4_ = fVar227;
              auVar179._12_4_ = fVar227;
              auVar70 = vfmadd132ps_fma(auVar179,auVar70,local_600._0_16_);
              fVar227 = local_650._0_4_ * 6.0;
              auVar156._4_4_ = fVar227;
              auVar156._0_4_ = fVar227;
              auVar156._8_4_ = fVar227;
              auVar156._12_4_ = fVar227;
              auVar70 = vfmadd132ps_fma(auVar156,auVar70,local_5c0._0_16_);
              auVar180._0_4_ = auVar70._0_4_ * (float)local_660._0_4_;
              auVar180._4_4_ = auVar70._4_4_ * (float)local_660._0_4_;
              auVar180._8_4_ = auVar70._8_4_ * (float)local_660._0_4_;
              auVar180._12_4_ = auVar70._12_4_ * (float)local_660._0_4_;
              auVar70 = vdpps_avx(auVar69,auVar70,0x7f);
              fVar227 = auVar70._0_4_;
              auVar157._0_4_ = auVar69._0_4_ * fVar227;
              auVar157._4_4_ = auVar69._4_4_ * fVar227;
              auVar157._8_4_ = auVar69._8_4_ * fVar227;
              auVar157._12_4_ = auVar69._12_4_ * fVar227;
              auVar70 = vsubps_avx(auVar180,auVar157);
              fVar227 = auVar75._0_4_ * (float)local_670._0_4_;
              auVar29._8_4_ = 0x80000000;
              auVar29._0_8_ = 0x8000000080000000;
              auVar29._12_4_ = 0x80000000;
              auVar81 = vxorps_avx512vl(auVar69,auVar29);
              auVar201._0_4_ = fVar222 * auVar70._0_4_ * fVar227;
              auVar201._4_4_ = fVar127 * auVar70._4_4_ * fVar227;
              auVar201._8_4_ = fVar225 * auVar70._8_4_ * fVar227;
              auVar201._12_4_ = fVar226 * auVar70._12_4_ * fVar227;
              auVar75 = vdpps_avx(auVar81,local_800,0x7f);
              auVar70 = vmaxss_avx(ZEXT416((uint)fVar214),
                                   ZEXT416((uint)((float)local_840._0_4_ * fVar223 * 1.9073486e-06))
                                  );
              auVar71 = vdivss_avx512f(ZEXT416((uint)fVar214),auVar77);
              auVar77 = vdpps_avx(local_720._0_16_,auVar201,0x7f);
              auVar76 = vfmadd213ss_fma(auVar76,ZEXT416((uint)fVar214),auVar70);
              auVar71 = vfmadd213ss_fma(ZEXT416((uint)(fVar241 + 1.0)),auVar71,auVar76);
              auVar76 = vdpps_avx(local_6e0._0_16_,local_800,0x7f);
              fVar222 = auVar75._0_4_ + auVar77._0_4_;
              auVar75 = vdpps_avx(local_720._0_16_,auVar81,0x7f);
              auVar80 = vmulss_avx512f(auVar80,auVar78);
              auVar78 = vmulss_avx512f(auVar78,auVar78);
              auVar77 = vdpps_avx(local_720._0_16_,local_6e0._0_16_,0x7f);
              auVar78 = vaddss_avx512f(auVar79,ZEXT416((uint)(auVar80._0_4_ * auVar78._0_4_)));
              auVar79 = vfnmadd231ss_avx512f(auVar75,local_7f0,ZEXT416((uint)fVar222));
              auVar80 = vfnmadd231ss_avx512f(auVar77,local_7f0,auVar76);
              auVar75 = vpermilps_avx(local_640,0xff);
              fVar224 = fVar224 - auVar75._0_4_;
              auVar75 = vshufps_avx(auVar69,auVar69,0xff);
              auVar77 = vfmsub213ss_fma(auVar79,auVar78,auVar75);
              fVar241 = auVar80._0_4_ * auVar78._0_4_;
              auVar78 = vfmsub231ss_fma(ZEXT416((uint)(auVar76._0_4_ * auVar77._0_4_)),
                                        ZEXT416((uint)fVar222),ZEXT416((uint)fVar241));
              fVar127 = auVar78._0_4_;
              auVar218._0_4_ = fVar241 / fVar127;
              auVar218._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar211._0_4_ = auVar77._0_4_ / fVar127;
              auVar211._4_12_ = auVar77._4_12_;
              auVar77 = vmulss_avx512f(local_7f0,auVar218);
              auVar78 = vmulss_avx512f(local_7f0,auVar211);
              fVar222 = fVar224 * (fVar222 / fVar127) - auVar78._0_4_;
              auVar205 = ZEXT464((uint)fVar222);
              fVar241 = local_820._0_4_ - (auVar77._0_4_ - fVar224 * (auVar76._0_4_ / fVar127));
              auVar237 = ZEXT464((uint)fVar241);
              fVar222 = (float)local_840._0_4_ - fVar222;
              uVar206 = 0;
              uVar239 = 0;
              uVar240 = 0;
              auVar76 = vandps_avx512vl(local_7f0,auVar248);
              if (auVar71._0_4_ <= auVar76._0_4_) {
                bVar10 = false;
                auVar249 = ZEXT864(0) << 0x20;
              }
              else {
                auVar77 = vfmadd231ss_fma(ZEXT416((uint)(auVar71._0_4_ + auVar70._0_4_)),local_6b0,
                                          ZEXT416(0x36000000));
                auVar76 = vandps_avx(auVar248,ZEXT416((uint)fVar224));
                auVar52._12_4_ = 0;
                auVar52._0_12_ = ZEXT812(0);
                auVar249 = ZEXT1264(ZEXT812(0)) << 0x20;
                if (auVar77._0_4_ <= auVar76._0_4_) {
                  bVar10 = false;
                }
                else {
                  fVar222 = fVar222 + (float)local_6a0._0_4_;
                  uVar206 = 0;
                  uVar239 = 0;
                  uVar240 = 0;
                  bVar10 = true;
                  if ((ray->super_RayK<1>).org.field_0.m128[3] <= fVar222) {
                    fVar224 = (ray->super_RayK<1>).tfar;
                    auVar205 = ZEXT464((uint)fVar224);
                    if (((fVar222 <= fVar224) && (0.0 <= fVar241)) && (fVar241 <= 1.0)) {
                      auVar76 = vrsqrt14ss_avx512f(auVar52 << 0x20,ZEXT416((uint)local_740._0_4_));
                      fVar127 = auVar76._0_4_;
                      pGVar5 = (context->scene->geometries).items[local_888].ptr;
                      if ((pGVar5->mask & (ray->super_RayK<1>).mask) != 0) {
                        fVar127 = fVar127 * 1.5 +
                                  local_740._0_4_ * -0.5 * fVar127 * fVar127 * fVar127;
                        auVar158._0_4_ = local_720._0_4_ * fVar127;
                        auVar158._4_4_ = local_720._4_4_ * fVar127;
                        auVar158._8_4_ = local_720._8_4_ * fVar127;
                        auVar158._12_4_ = local_720._12_4_ * fVar127;
                        auVar77 = vfmadd213ps_fma(auVar75,auVar158,auVar69);
                        auVar76 = vshufps_avx(auVar158,auVar158,0xc9);
                        auVar75 = vshufps_avx(auVar69,auVar69,0xc9);
                        auVar159._0_4_ = auVar158._0_4_ * auVar75._0_4_;
                        auVar159._4_4_ = auVar158._4_4_ * auVar75._4_4_;
                        auVar159._8_4_ = auVar158._8_4_ * auVar75._8_4_;
                        auVar159._12_4_ = auVar158._12_4_ * auVar75._12_4_;
                        auVar69 = vfmsub231ps_fma(auVar159,auVar69,auVar76);
                        auVar76 = vshufps_avx(auVar69,auVar69,0xc9);
                        auVar75 = vshufps_avx(auVar77,auVar77,0xc9);
                        auVar69 = vshufps_avx(auVar69,auVar69,0xd2);
                        auVar133._0_4_ = auVar77._0_4_ * auVar69._0_4_;
                        auVar133._4_4_ = auVar77._4_4_ * auVar69._4_4_;
                        auVar133._8_4_ = auVar77._8_4_ * auVar69._8_4_;
                        auVar133._12_4_ = auVar77._12_4_ * auVar69._12_4_;
                        auVar76 = vfmsub231ps_fma(auVar133,auVar76,auVar75);
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          (ray->super_RayK<1>).tfar = fVar222;
                          auVar75 = vshufps_avx(auVar76,auVar76,0xe9);
                          uVar18 = vmovlps_avx(auVar75);
                          *(undefined8 *)&(ray->Ng).field_0 = uVar18;
                          (ray->Ng).field_0.field_0.z = auVar76._0_4_;
                          ray->u = fVar241;
                          ray->v = 0.0;
                          ray->primID = (uint)local_848;
                          ray->geomID = (uint)local_888;
                          ray->instID[0] = context->user->instID[0];
                          ray->instPrimID[0] = context->user->instPrimID[0];
                        }
                        else {
                          auVar75 = vshufps_avx(auVar76,auVar76,0xe9);
                          local_780 = vmovlps_avx(auVar75);
                          local_778 = auVar76._0_4_;
                          local_774 = fVar241;
                          local_770 = 0;
                          local_76c = (uint)local_848;
                          local_768 = (uint)local_888;
                          local_764 = context->user->instID[0];
                          local_760 = context->user->instPrimID[0];
                          (ray->super_RayK<1>).tfar = fVar222;
                          local_88c = -1;
                          local_7d0.valid = &local_88c;
                          local_7d0.geometryUserPtr = pGVar5->userPtr;
                          local_7d0.context = context->user;
                          local_7d0.ray = (RTCRayN *)ray;
                          local_7d0.hit = (RTCHitN *)&local_780;
                          local_7d0.N = 1;
                          local_820._0_16_ = ZEXT416((uint)fVar241);
                          local_840._0_16_ = ZEXT416((uint)fVar222);
                          local_880._0_4_ = fVar224;
                          if (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01bf6695:
                            p_Var9 = context->args->filter;
                            if (p_Var9 != (RTCFilterFunctionN)0x0) {
                              if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                                 (((pGVar5->field_8).field_0x2 & 0x40) != 0)) {
                                (*p_Var9)(&local_7d0);
                                auVar205 = ZEXT464((uint)local_880._0_4_);
                                auVar237 = ZEXT1664(local_820._0_16_);
                                auVar249 = ZEXT1664(ZEXT816(0) << 0x40);
                                auVar248._8_4_ = 0x7fffffff;
                                auVar248._0_8_ = 0x7fffffff7fffffff;
                                auVar248._12_4_ = 0x7fffffff;
                                fVar222 = (float)local_840._0_4_;
                                uVar206 = local_840._4_4_;
                                uVar239 = local_840._8_4_;
                                uVar240 = local_840._12_4_;
                              }
                              if (*local_7d0.valid == 0) goto LAB_01bf674e;
                            }
                            (((Vec3f *)((long)local_7d0.ray + 0x30))->field_0).components[0] =
                                 *(float *)local_7d0.hit;
                            (((Vec3f *)((long)local_7d0.ray + 0x30))->field_0).field_0.y =
                                 *(float *)(local_7d0.hit + 4);
                            (((Vec3f *)((long)local_7d0.ray + 0x30))->field_0).field_0.z =
                                 *(float *)(local_7d0.hit + 8);
                            *(float *)((long)local_7d0.ray + 0x3c) = *(float *)(local_7d0.hit + 0xc)
                            ;
                            *(float *)((long)local_7d0.ray + 0x40) =
                                 *(float *)(local_7d0.hit + 0x10);
                            *(float *)((long)local_7d0.ray + 0x44) =
                                 *(float *)(local_7d0.hit + 0x14);
                            *(float *)((long)local_7d0.ray + 0x48) =
                                 *(float *)(local_7d0.hit + 0x18);
                            *(float *)((long)local_7d0.ray + 0x4c) =
                                 *(float *)(local_7d0.hit + 0x1c);
                            *(float *)((long)local_7d0.ray + 0x50) =
                                 *(float *)(local_7d0.hit + 0x20);
                          }
                          else {
                            (*pGVar5->intersectionFilterN)(&local_7d0);
                            auVar205 = ZEXT464((uint)local_880._0_4_);
                            auVar237 = ZEXT1664(local_820._0_16_);
                            auVar249 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar248._8_4_ = 0x7fffffff;
                            auVar248._0_8_ = 0x7fffffff7fffffff;
                            auVar248._12_4_ = 0x7fffffff;
                            fVar222 = (float)local_840._0_4_;
                            uVar206 = local_840._4_4_;
                            uVar239 = local_840._8_4_;
                            uVar240 = local_840._12_4_;
                            if (*local_7d0.valid != 0) goto LAB_01bf6695;
LAB_01bf674e:
                            (ray->super_RayK<1>).tfar = auVar205._0_4_;
                          }
                        }
                      }
                    }
                  }
                }
              }
              bVar65 = lVar64 != 0;
              lVar64 = lVar64 + -1;
            } while ((!bVar10) && (bVar65));
            auVar56._4_4_ = fStack_4fc;
            auVar56._0_4_ = local_500;
            auVar56._8_4_ = fStack_4f8;
            auVar56._12_4_ = fStack_4f4;
            auVar56._16_4_ = fStack_4f0;
            auVar56._20_4_ = fStack_4ec;
            auVar56._24_4_ = fStack_4e8;
            auVar56._28_4_ = fStack_4e4;
            fVar222 = (ray->super_RayK<1>).tfar;
            auVar39._4_4_ = fVar222;
            auVar39._0_4_ = fVar222;
            auVar39._8_4_ = fVar222;
            auVar39._12_4_ = fVar222;
            auVar39._16_4_ = fVar222;
            auVar39._20_4_ = fVar222;
            auVar39._24_4_ = fVar222;
            auVar39._28_4_ = fVar222;
            uVar18 = vcmpps_avx512vl(auVar56,auVar39,2);
            bVar61 = ~('\x01' << ((byte)iVar21 & 0x1f)) & bVar61 & (byte)uVar18;
          } while (bVar61 != 0);
        }
        auVar144._0_4_ = (float)local_580._0_4_ + (float)local_700._0_4_;
        auVar144._4_4_ = (float)local_580._4_4_ + (float)local_700._4_4_;
        auVar144._8_4_ = fStack_578 + fStack_6f8;
        auVar144._12_4_ = fStack_574 + fStack_6f4;
        auVar144._16_4_ = fStack_570 + fStack_6f0;
        auVar144._20_4_ = fStack_56c + fStack_6ec;
        auVar144._24_4_ = fStack_568 + fStack_6e8;
        auVar144._28_4_ = fStack_564 + fStack_6e4;
        fVar214 = (ray->super_RayK<1>).tfar;
        auVar40._4_4_ = fVar214;
        auVar40._0_4_ = fVar214;
        auVar40._8_4_ = fVar214;
        auVar40._12_4_ = fVar214;
        auVar40._16_4_ = fVar214;
        auVar40._20_4_ = fVar214;
        auVar40._24_4_ = fVar214;
        auVar40._28_4_ = fVar214;
        uVar18 = vcmpps_avx512vl(auVar144,auVar40,2);
        bVar62 = (byte)local_794 | (byte)local_79c;
        bVar58 = (byte)uVar19 & bVar58 & (byte)uVar18;
        auVar145._8_4_ = 2;
        auVar145._0_8_ = 0x200000002;
        auVar145._12_4_ = 2;
        auVar145._16_4_ = 2;
        auVar145._20_4_ = 2;
        auVar145._24_4_ = 2;
        auVar145._28_4_ = 2;
        auVar41._8_4_ = 3;
        auVar41._0_8_ = 0x300000003;
        auVar41._12_4_ = 3;
        auVar41._16_4_ = 3;
        auVar41._20_4_ = 3;
        auVar41._24_4_ = 3;
        auVar41._28_4_ = 3;
        auVar83 = vpblendmd_avx512vl(auVar145,auVar41);
        auVar94._0_4_ = (uint)(bVar62 & 1) * auVar83._0_4_ | (uint)!(bool)(bVar62 & 1) * 2;
        bVar10 = (bool)(bVar62 >> 1 & 1);
        auVar94._4_4_ = (uint)bVar10 * auVar83._4_4_ | (uint)!bVar10 * 2;
        bVar10 = (bool)(bVar62 >> 2 & 1);
        auVar94._8_4_ = (uint)bVar10 * auVar83._8_4_ | (uint)!bVar10 * 2;
        bVar10 = (bool)(bVar62 >> 3 & 1);
        auVar94._12_4_ = (uint)bVar10 * auVar83._12_4_ | (uint)!bVar10 * 2;
        bVar10 = (bool)(bVar62 >> 4 & 1);
        auVar94._16_4_ = (uint)bVar10 * auVar83._16_4_ | (uint)!bVar10 * 2;
        bVar10 = (bool)(bVar62 >> 5 & 1);
        auVar94._20_4_ = (uint)bVar10 * auVar83._20_4_ | (uint)!bVar10 * 2;
        bVar10 = (bool)(bVar62 >> 6 & 1);
        auVar94._24_4_ = (uint)bVar10 * auVar83._24_4_ | (uint)!bVar10 * 2;
        auVar94._28_4_ = (uint)(bVar62 >> 7) * auVar83._28_4_ | (uint)!(bool)(bVar62 >> 7) * 2;
        _local_580 = auVar94;
        uVar18 = vpcmpd_avx512vl(auVar94,local_480,2);
        bVar62 = (byte)uVar18 & bVar58;
        if (bVar62 != 0) {
          auVar75 = vminps_avx(local_5c0._0_16_,local_600._0_16_);
          auVar76 = vmaxps_avx(local_5c0._0_16_,local_600._0_16_);
          auVar69 = vminps_avx(local_5e0._0_16_,local_620._0_16_);
          auVar77 = vminps_avx(auVar75,auVar69);
          auVar75 = vmaxps_avx(local_5e0._0_16_,local_620._0_16_);
          auVar69 = vmaxps_avx(auVar76,auVar75);
          auVar76 = vandps_avx(auVar248,auVar77);
          auVar75 = vandps_avx(auVar248,auVar69);
          auVar76 = vmaxps_avx(auVar76,auVar75);
          auVar75 = vmovshdup_avx(auVar76);
          auVar75 = vmaxss_avx(auVar75,auVar76);
          auVar76 = vshufpd_avx(auVar76,auVar76,1);
          auVar76 = vmaxss_avx(auVar76,auVar75);
          fVar214 = auVar76._0_4_ * 1.9073486e-06;
          local_6b0 = vshufps_avx(auVar69,auVar69,0xff);
          _local_5a0 = _local_400;
          local_500 = (float)local_400._0_4_ + (float)local_700._0_4_;
          fStack_4fc = (float)local_400._4_4_ + (float)local_700._4_4_;
          fStack_4f8 = fStack_3f8 + fStack_6f8;
          fStack_4f4 = fStack_3f4 + fStack_6f4;
          fStack_4f0 = fStack_3f0 + fStack_6f0;
          fStack_4ec = fStack_3ec + fStack_6ec;
          fStack_4e8 = fStack_3e8 + fStack_6e8;
          fStack_4e4 = fStack_3e4 + fStack_6e4;
          do {
            auVar85 = local_880;
            auVar146._8_4_ = 0x7f800000;
            auVar146._0_8_ = 0x7f8000007f800000;
            auVar146._12_4_ = 0x7f800000;
            auVar146._16_4_ = 0x7f800000;
            auVar146._20_4_ = 0x7f800000;
            auVar146._24_4_ = 0x7f800000;
            auVar146._28_4_ = 0x7f800000;
            auVar83 = vblendmps_avx512vl(auVar146,_local_5a0);
            auVar94._0_4_ =
                 (uint)(bVar62 & 1) * auVar83._0_4_ | (uint)!(bool)(bVar62 & 1) * 0x7f800000;
            bVar10 = (bool)(bVar62 >> 1 & 1);
            auVar94._4_4_ = (uint)bVar10 * auVar83._4_4_ | (uint)!bVar10 * 0x7f800000;
            bVar10 = (bool)(bVar62 >> 2 & 1);
            auVar94._8_4_ = (uint)bVar10 * auVar83._8_4_ | (uint)!bVar10 * 0x7f800000;
            bVar10 = (bool)(bVar62 >> 3 & 1);
            auVar94._12_4_ = (uint)bVar10 * auVar83._12_4_ | (uint)!bVar10 * 0x7f800000;
            bVar10 = (bool)(bVar62 >> 4 & 1);
            auVar94._16_4_ = (uint)bVar10 * auVar83._16_4_ | (uint)!bVar10 * 0x7f800000;
            bVar10 = (bool)(bVar62 >> 5 & 1);
            auVar94._20_4_ = (uint)bVar10 * auVar83._20_4_ | (uint)!bVar10 * 0x7f800000;
            bVar10 = (bool)(bVar62 >> 6 & 1);
            auVar94._24_4_ = (uint)bVar10 * auVar83._24_4_ | (uint)!bVar10 * 0x7f800000;
            auVar94._28_4_ =
                 (uint)(bVar62 >> 7) * auVar83._28_4_ | (uint)!(bool)(bVar62 >> 7) * 0x7f800000;
            auVar83 = vshufps_avx(auVar94,auVar94,0xb1);
            auVar83 = vminps_avx(auVar94,auVar83);
            auVar84 = vshufpd_avx(auVar83,auVar83,5);
            auVar83 = vminps_avx(auVar83,auVar84);
            auVar84 = vpermpd_avx2(auVar83,0x4e);
            auVar83 = vminps_avx(auVar83,auVar84);
            uVar18 = vcmpps_avx512vl(auVar94,auVar83,0);
            bVar59 = (byte)uVar18 & bVar62;
            bVar61 = bVar62;
            if (bVar59 != 0) {
              bVar61 = bVar59;
            }
            iVar21 = 0;
            for (uVar67 = (uint)bVar61; (uVar67 & 1) == 0; uVar67 = uVar67 >> 1 | 0x80000000) {
              iVar21 = iVar21 + 1;
            }
            aVar2 = (ray->super_RayK<1>).dir.field_0;
            local_6e0._0_16_ = (undefined1  [16])aVar2;
            auVar76 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
            if (auVar76._0_4_ < 0.0) {
              local_820._0_16_ = ZEXT416((uint)*(float *)(local_4e0 + (uint)(iVar21 << 2)));
              local_840._0_16_ = ZEXT416((uint)*(float *)(local_3e0 + (uint)(iVar21 << 2)));
              local_880[1] = 0;
              local_880[0] = bVar62;
              local_880._2_30_ = auVar85._2_30_;
              fVar224 = sqrtf(auVar76._0_4_);
              bVar62 = local_880[0];
              auVar249 = ZEXT1664(ZEXT816(0) << 0x40);
              fVar223 = (float)local_820._0_4_;
              uVar206 = local_820._4_4_;
              uVar239 = local_820._8_4_;
              uVar240 = local_820._12_4_;
              fVar222 = (float)local_840._0_4_;
              uVar244 = local_840._4_4_;
              uVar245 = local_840._8_4_;
              uVar246 = local_840._12_4_;
            }
            else {
              auVar76 = vsqrtss_avx(auVar76,auVar76);
              fVar224 = auVar76._0_4_;
              fVar223 = *(float *)(local_4e0 + (uint)(iVar21 << 2));
              uVar206 = 0;
              uVar239 = 0;
              uVar240 = 0;
              fVar222 = *(float *)(local_3e0 + (uint)(iVar21 << 2));
              uVar244 = 0;
              uVar245 = 0;
              uVar246 = 0;
            }
            lVar64 = 4;
            do {
              auVar84 = local_820;
              auVar83 = local_840;
              auVar134._4_4_ = fVar222;
              auVar134._0_4_ = fVar222;
              auVar134._8_4_ = fVar222;
              auVar134._12_4_ = fVar222;
              auVar78 = auVar249._0_16_;
              auVar75 = vfmadd132ps_fma(auVar134,auVar78,local_6e0._0_16_);
              fVar241 = 1.0 - fVar223;
              auVar181._0_4_ = local_600._0_4_ * fVar223;
              auVar181._4_4_ = local_600._4_4_ * fVar223;
              auVar181._8_4_ = local_600._8_4_ * fVar223;
              auVar181._12_4_ = local_600._12_4_ * fVar223;
              local_650 = ZEXT416((uint)fVar241);
              auVar193._4_4_ = fVar241;
              auVar193._0_4_ = fVar241;
              auVar193._8_4_ = fVar241;
              auVar193._12_4_ = fVar241;
              auVar76 = vfmadd231ps_fma(auVar181,auVar193,local_5c0._0_16_);
              auVar202._0_4_ = local_5e0._0_4_ * fVar223;
              auVar202._4_4_ = local_5e0._4_4_ * fVar223;
              auVar202._8_4_ = local_5e0._8_4_ * fVar223;
              auVar202._12_4_ = local_5e0._12_4_ * fVar223;
              auVar69 = vfmadd231ps_fma(auVar202,auVar193,local_600._0_16_);
              auVar212._0_4_ = fVar223 * (float)local_620._0_4_;
              auVar212._4_4_ = fVar223 * (float)local_620._4_4_;
              auVar212._8_4_ = fVar223 * fStack_618;
              auVar212._12_4_ = fVar223 * fStack_614;
              auVar77 = vfmadd231ps_fma(auVar212,auVar193,local_5e0._0_16_);
              auVar219._0_4_ = fVar223 * auVar69._0_4_;
              auVar219._4_4_ = fVar223 * auVar69._4_4_;
              auVar219._8_4_ = fVar223 * auVar69._8_4_;
              auVar219._12_4_ = fVar223 * auVar69._12_4_;
              auVar76 = vfmadd231ps_fma(auVar219,auVar193,auVar76);
              auVar182._0_4_ = fVar223 * auVar77._0_4_;
              auVar182._4_4_ = fVar223 * auVar77._4_4_;
              auVar182._8_4_ = fVar223 * auVar77._8_4_;
              auVar182._12_4_ = fVar223 * auVar77._12_4_;
              auVar69 = vfmadd231ps_fma(auVar182,auVar193,auVar69);
              auVar203._0_4_ = fVar223 * auVar69._0_4_;
              auVar203._4_4_ = fVar223 * auVar69._4_4_;
              auVar203._8_4_ = fVar223 * auVar69._8_4_;
              auVar203._12_4_ = fVar223 * auVar69._12_4_;
              local_640 = vfmadd231ps_fma(auVar203,auVar76,auVar193);
              auVar76 = vsubps_avx(auVar69,auVar76);
              auVar30._8_4_ = 0x40400000;
              auVar30._0_8_ = 0x4040000040400000;
              auVar30._12_4_ = 0x40400000;
              auVar77 = auVar94._16_16_;
              auVar69 = vmulps_avx512vl(auVar76,auVar30);
              auVar76 = vsubps_avx(auVar75,local_640);
              local_720._0_16_ = auVar76;
              auVar76 = vdpps_avx(auVar76,auVar76,0x7f);
              local_880._0_16_ = auVar69;
              local_740._0_16_ = auVar76;
              local_820._4_4_ = uVar206;
              local_820._0_4_ = fVar223;
              local_820._8_4_ = uVar239;
              local_820._16_16_ = auVar84._16_16_;
              local_820._12_4_ = uVar240;
              local_840._4_4_ = uVar244;
              local_840._0_4_ = fVar222;
              local_840._8_4_ = uVar245;
              local_840._16_16_ = auVar83._16_16_;
              local_840._12_4_ = uVar246;
              if (auVar76._0_4_ < 0.0) {
                auVar148._0_4_ = sqrtf(auVar76._0_4_);
                auVar148._4_60_ = extraout_var_01;
                auVar78 = ZEXT816(0) << 0x40;
                auVar76 = auVar148._0_16_;
                auVar69 = local_880._0_16_;
              }
              else {
                auVar76 = vsqrtss_avx(auVar76,auVar76);
              }
              local_660 = vdpps_avx(auVar69,auVar69,0x7f);
              fVar223 = local_660._0_4_;
              auVar160._4_12_ = auVar78._4_12_;
              auVar160._0_4_ = fVar223;
              local_7f0 = vrsqrt14ss_avx512f(auVar78,auVar160);
              fVar222 = local_7f0._0_4_ * 1.5;
              local_670 = vrcp14ss_avx512f(auVar78,auVar160);
              auVar31._8_4_ = 0x80000000;
              auVar31._0_8_ = 0x8000000080000000;
              auVar31._12_4_ = 0x80000000;
              auVar70 = vxorps_avx512vl(local_660,auVar31);
              auVar75 = vfnmadd213ss_fma(local_670,local_660,ZEXT416(0x40000000));
              uVar67 = auVar76._0_4_;
              if (fVar223 < auVar70._0_4_) {
                local_800._0_4_ = fVar222;
                auVar149._0_4_ = sqrtf(fVar223);
                auVar149._4_60_ = extraout_var_02;
                auVar76 = ZEXT416(uVar67);
                auVar78 = ZEXT816(0) << 0x40;
                auVar70 = auVar149._0_16_;
                auVar69 = local_880._0_16_;
              }
              else {
                auVar70 = vsqrtss_avx512f(local_660,local_660);
                local_800._0_4_ = fVar222;
              }
              fVar222 = local_7f0._0_4_;
              fVar222 = (float)local_800._0_4_ + fVar223 * -0.5 * fVar222 * fVar222 * fVar222;
              local_800._0_4_ = auVar69._0_4_ * fVar222;
              local_800._4_4_ = auVar69._4_4_ * fVar222;
              local_800._8_4_ = auVar69._8_4_ * fVar222;
              local_800._12_4_ = auVar69._12_4_ * fVar222;
              local_7f0 = vdpps_avx(local_720._0_16_,local_800,0x7f);
              fVar241 = auVar76._0_4_;
              auVar135._0_4_ = local_7f0._0_4_ * local_7f0._0_4_;
              auVar135._4_4_ = local_7f0._4_4_ * local_7f0._4_4_;
              auVar135._8_4_ = local_7f0._8_4_ * local_7f0._8_4_;
              auVar135._12_4_ = local_7f0._12_4_ * local_7f0._12_4_;
              auVar79 = vsubps_avx(local_740._0_16_,auVar135);
              fVar223 = auVar79._0_4_;
              auVar161._4_12_ = auVar78._4_12_;
              auVar161._0_4_ = fVar223;
              auVar78 = vrsqrt14ss_avx512f(auVar78,auVar161);
              auVar80 = vmulss_avx512f(auVar78,ZEXT416(0x3fc00000));
              auVar71 = vmulss_avx512f(auVar79,ZEXT416(0xbf000000));
              if (fVar223 < 0.0) {
                local_690 = fVar222;
                fStack_68c = fVar222;
                fStack_688 = fVar222;
                fStack_684 = fVar222;
                local_680 = auVar78;
                fVar127 = sqrtf(fVar223);
                auVar71 = ZEXT416(auVar71._0_4_);
                auVar80 = ZEXT416(auVar80._0_4_);
                auVar70 = ZEXT416(auVar70._0_4_);
                auVar76 = ZEXT416(uVar67);
                auVar69 = local_880._0_16_;
                auVar78 = local_680;
                fVar222 = local_690;
                fVar223 = fStack_68c;
                fVar225 = fStack_688;
                fVar226 = fStack_684;
              }
              else {
                auVar79 = vsqrtss_avx(auVar79,auVar79);
                fVar127 = auVar79._0_4_;
                fVar223 = fVar222;
                fVar225 = fVar222;
                fVar226 = fVar222;
              }
              auVar236._8_4_ = 0x7fffffff;
              auVar236._0_8_ = 0x7fffffff7fffffff;
              auVar236._12_4_ = 0x7fffffff;
              auVar237 = ZEXT1664(auVar236);
              auVar79 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_820._0_16_,local_650);
              fVar227 = auVar79._0_4_ * 6.0;
              fVar17 = local_820._0_4_ * 6.0;
              auVar183._0_4_ = fVar17 * (float)local_620._0_4_;
              auVar183._4_4_ = fVar17 * (float)local_620._4_4_;
              auVar183._8_4_ = fVar17 * fStack_618;
              auVar183._12_4_ = fVar17 * fStack_614;
              auVar162._4_4_ = fVar227;
              auVar162._0_4_ = fVar227;
              auVar162._8_4_ = fVar227;
              auVar162._12_4_ = fVar227;
              auVar79 = vfmadd132ps_fma(auVar162,auVar183,local_5e0._0_16_);
              auVar81 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_650,local_820._0_16_);
              fVar227 = auVar81._0_4_ * 6.0;
              auVar184._4_4_ = fVar227;
              auVar184._0_4_ = fVar227;
              auVar184._8_4_ = fVar227;
              auVar184._12_4_ = fVar227;
              auVar79 = vfmadd132ps_fma(auVar184,auVar79,local_600._0_16_);
              fVar227 = local_650._0_4_ * 6.0;
              auVar163._4_4_ = fVar227;
              auVar163._0_4_ = fVar227;
              auVar163._8_4_ = fVar227;
              auVar163._12_4_ = fVar227;
              auVar79 = vfmadd132ps_fma(auVar163,auVar79,local_5c0._0_16_);
              auVar185._0_4_ = auVar79._0_4_ * (float)local_660._0_4_;
              auVar185._4_4_ = auVar79._4_4_ * (float)local_660._0_4_;
              auVar185._8_4_ = auVar79._8_4_ * (float)local_660._0_4_;
              auVar185._12_4_ = auVar79._12_4_ * (float)local_660._0_4_;
              auVar79 = vdpps_avx(auVar69,auVar79,0x7f);
              fVar227 = auVar79._0_4_;
              auVar164._0_4_ = auVar69._0_4_ * fVar227;
              auVar164._4_4_ = auVar69._4_4_ * fVar227;
              auVar164._8_4_ = auVar69._8_4_ * fVar227;
              auVar164._12_4_ = auVar69._12_4_ * fVar227;
              auVar79 = vsubps_avx(auVar185,auVar164);
              fVar227 = auVar75._0_4_ * (float)local_670._0_4_;
              auVar32._8_4_ = 0x80000000;
              auVar32._0_8_ = 0x8000000080000000;
              auVar32._12_4_ = 0x80000000;
              auVar82 = vxorps_avx512vl(auVar69,auVar32);
              auVar204._0_4_ = fVar222 * auVar79._0_4_ * fVar227;
              auVar204._4_4_ = fVar223 * auVar79._4_4_ * fVar227;
              auVar204._8_4_ = fVar225 * auVar79._8_4_ * fVar227;
              auVar204._12_4_ = fVar226 * auVar79._12_4_ * fVar227;
              auVar75 = vdpps_avx(auVar82,local_800,0x7f);
              auVar79 = vmaxss_avx(ZEXT416((uint)fVar214),
                                   ZEXT416((uint)((float)local_840._0_4_ * fVar224 * 1.9073486e-06))
                                  );
              auVar81 = vdivss_avx512f(ZEXT416((uint)fVar214),auVar70);
              auVar70 = vdpps_avx(local_720._0_16_,auVar204,0x7f);
              auVar76 = vfmadd213ss_fma(auVar76,ZEXT416((uint)fVar214),auVar79);
              auVar81 = vfmadd213ss_fma(ZEXT416((uint)(fVar241 + 1.0)),auVar81,auVar76);
              auVar76 = vdpps_avx(local_6e0._0_16_,local_800,0x7f);
              fVar222 = auVar75._0_4_ + auVar70._0_4_;
              auVar75 = vdpps_avx(local_720._0_16_,auVar82,0x7f);
              auVar70 = vmulss_avx512f(auVar71,auVar78);
              auVar71 = vmulss_avx512f(auVar78,auVar78);
              auVar78 = vdpps_avx(local_720._0_16_,local_6e0._0_16_,0x7f);
              auVar70 = vaddss_avx512f(auVar80,ZEXT416((uint)(auVar70._0_4_ * auVar71._0_4_)));
              auVar80 = vfnmadd231ss_avx512f(auVar75,local_7f0,ZEXT416((uint)fVar222));
              auVar71 = vfnmadd231ss_avx512f(auVar78,local_7f0,auVar76);
              auVar75 = vpermilps_avx(local_640,0xff);
              fVar127 = fVar127 - auVar75._0_4_;
              auVar75 = vshufps_avx(auVar69,auVar69,0xff);
              auVar78 = vfmsub213ss_fma(auVar80,auVar70,auVar75);
              fVar223 = auVar71._0_4_ * auVar70._0_4_;
              auVar70 = vfmsub231ss_fma(ZEXT416((uint)(auVar76._0_4_ * auVar78._0_4_)),
                                        ZEXT416((uint)fVar222),ZEXT416((uint)fVar223));
              fVar241 = auVar70._0_4_;
              auVar220._0_4_ = fVar223 / fVar241;
              auVar220._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar213._0_4_ = auVar78._0_4_ / fVar241;
              auVar213._4_12_ = auVar78._4_12_;
              auVar78 = vmulss_avx512f(local_7f0,auVar220);
              auVar70 = vmulss_avx512f(local_7f0,auVar213);
              fVar222 = fVar127 * (fVar222 / fVar241) - auVar70._0_4_;
              auVar205 = ZEXT464((uint)fVar222);
              fVar223 = local_820._0_4_ - (auVar78._0_4_ - fVar127 * (auVar76._0_4_ / fVar241));
              uVar206 = 0;
              uVar239 = 0;
              uVar240 = 0;
              fVar222 = (float)local_840._0_4_ - fVar222;
              uVar244 = 0;
              uVar245 = 0;
              uVar246 = 0;
              auVar94._0_16_ = vandps_avx512vl(local_7f0,auVar236);
              auVar94._16_16_ = auVar77;
              if (auVar81._0_4_ <= auVar94._0_4_) {
                bVar10 = false;
                auVar249 = ZEXT864(0) << 0x20;
              }
              else {
                auVar78 = vfmadd231ss_fma(ZEXT416((uint)(auVar81._0_4_ + auVar79._0_4_)),local_6b0,
                                          ZEXT416(0x36000000));
                auVar76 = vandps_avx(auVar236,ZEXT416((uint)fVar127));
                auVar53._12_4_ = 0;
                auVar53._0_12_ = ZEXT812(0);
                auVar249 = ZEXT1264(ZEXT812(0)) << 0x20;
                if (auVar78._0_4_ <= auVar76._0_4_) {
                  bVar10 = false;
                }
                else {
                  fVar222 = fVar222 + (float)local_6a0._0_4_;
                  uVar244 = 0;
                  uVar245 = 0;
                  uVar246 = 0;
                  bVar10 = true;
                  if ((ray->super_RayK<1>).org.field_0.m128[3] <= fVar222) {
                    fVar241 = (ray->super_RayK<1>).tfar;
                    auVar205 = ZEXT464((uint)fVar241);
                    if (((fVar222 <= fVar241) && (0.0 <= fVar223)) && (fVar223 <= 1.0)) {
                      auVar94._0_16_ =
                           vrsqrt14ss_avx512f(auVar53 << 0x20,ZEXT416((uint)local_740._0_4_));
                      fVar127 = auVar94._0_4_;
                      pGVar5 = (context->scene->geometries).items[local_888].ptr;
                      if ((pGVar5->mask & (ray->super_RayK<1>).mask) != 0) {
                        fVar127 = fVar127 * 1.5 +
                                  local_740._0_4_ * -0.5 * fVar127 * fVar127 * fVar127;
                        auVar165._0_4_ = local_720._0_4_ * fVar127;
                        auVar165._4_4_ = local_720._4_4_ * fVar127;
                        auVar165._8_4_ = local_720._8_4_ * fVar127;
                        auVar165._12_4_ = local_720._12_4_ * fVar127;
                        auVar77 = vfmadd213ps_fma(auVar75,auVar165,auVar69);
                        auVar76 = vshufps_avx(auVar165,auVar165,0xc9);
                        auVar75 = vshufps_avx(auVar69,auVar69,0xc9);
                        auVar166._0_4_ = auVar165._0_4_ * auVar75._0_4_;
                        auVar166._4_4_ = auVar165._4_4_ * auVar75._4_4_;
                        auVar166._8_4_ = auVar165._8_4_ * auVar75._8_4_;
                        auVar166._12_4_ = auVar165._12_4_ * auVar75._12_4_;
                        auVar69 = vfmsub231ps_fma(auVar166,auVar69,auVar76);
                        auVar76 = vshufps_avx(auVar69,auVar69,0xc9);
                        auVar75 = vshufps_avx(auVar77,auVar77,0xc9);
                        auVar69 = vshufps_avx(auVar69,auVar69,0xd2);
                        auVar136._0_4_ = auVar77._0_4_ * auVar69._0_4_;
                        auVar136._4_4_ = auVar77._4_4_ * auVar69._4_4_;
                        auVar136._8_4_ = auVar77._8_4_ * auVar69._8_4_;
                        auVar136._12_4_ = auVar77._12_4_ * auVar69._12_4_;
                        auVar76 = vfmsub231ps_fma(auVar136,auVar76,auVar75);
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          (ray->super_RayK<1>).tfar = fVar222;
                          auVar75 = vshufps_avx(auVar76,auVar76,0xe9);
                          uVar18 = vmovlps_avx(auVar75);
                          *(undefined8 *)&(ray->Ng).field_0 = uVar18;
                          (ray->Ng).field_0.field_0.z = auVar76._0_4_;
                          ray->u = fVar223;
                          ray->v = 0.0;
                          ray->primID = (uint)local_848;
                          ray->geomID = (uint)local_888;
                          ray->instID[0] = context->user->instID[0];
                          ray->instPrimID[0] = context->user->instPrimID[0];
                        }
                        else {
                          auVar75 = vshufps_avx(auVar76,auVar76,0xe9);
                          local_780 = vmovlps_avx(auVar75);
                          local_778 = auVar76._0_4_;
                          local_774 = fVar223;
                          local_770 = 0;
                          local_76c = (uint)local_848;
                          local_768 = (uint)local_888;
                          local_764 = context->user->instID[0];
                          local_760 = context->user->instPrimID[0];
                          (ray->super_RayK<1>).tfar = fVar222;
                          local_88c = -1;
                          local_7d0.valid = &local_88c;
                          local_7d0.geometryUserPtr = pGVar5->userPtr;
                          local_7d0.context = context->user;
                          local_7d0.ray = (RTCRayN *)ray;
                          local_7d0.hit = (RTCHitN *)&local_780;
                          local_7d0.N = 1;
                          local_820._0_16_ = ZEXT416((uint)fVar223);
                          local_840._0_16_ = ZEXT416((uint)fVar222);
                          local_880._0_4_ = fVar241;
                          if (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01bf7087:
                            p_Var9 = context->args->filter;
                            if (p_Var9 != (RTCFilterFunctionN)0x0) {
                              if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                                 (((pGVar5->field_8).field_0x2 & 0x40) != 0)) {
                                auVar237 = ZEXT1664(auVar237._0_16_);
                                (*p_Var9)(&local_7d0);
                                auVar205 = ZEXT464((uint)local_880._0_4_);
                                auVar249 = ZEXT1664(ZEXT816(0) << 0x40);
                                fVar223 = (float)local_820._0_4_;
                                uVar206 = local_820._4_4_;
                                uVar239 = local_820._8_4_;
                                uVar240 = local_820._12_4_;
                                fVar222 = (float)local_840._0_4_;
                                uVar244 = local_840._4_4_;
                                uVar245 = local_840._8_4_;
                                uVar246 = local_840._12_4_;
                              }
                              if (*local_7d0.valid == 0) goto LAB_01bf7137;
                            }
                            (((Vec3f *)((long)local_7d0.ray + 0x30))->field_0).components[0] =
                                 *(float *)local_7d0.hit;
                            (((Vec3f *)((long)local_7d0.ray + 0x30))->field_0).field_0.y =
                                 *(float *)(local_7d0.hit + 4);
                            (((Vec3f *)((long)local_7d0.ray + 0x30))->field_0).field_0.z =
                                 *(float *)(local_7d0.hit + 8);
                            *(float *)((long)local_7d0.ray + 0x3c) = *(float *)(local_7d0.hit + 0xc)
                            ;
                            *(float *)((long)local_7d0.ray + 0x40) =
                                 *(float *)(local_7d0.hit + 0x10);
                            *(float *)((long)local_7d0.ray + 0x44) =
                                 *(float *)(local_7d0.hit + 0x14);
                            *(float *)((long)local_7d0.ray + 0x48) =
                                 *(float *)(local_7d0.hit + 0x18);
                            *(float *)((long)local_7d0.ray + 0x4c) =
                                 *(float *)(local_7d0.hit + 0x1c);
                            *(float *)((long)local_7d0.ray + 0x50) =
                                 *(float *)(local_7d0.hit + 0x20);
                          }
                          else {
                            auVar237 = ZEXT1664(auVar236);
                            (*pGVar5->intersectionFilterN)(&local_7d0);
                            auVar205 = ZEXT464((uint)local_880._0_4_);
                            auVar249 = ZEXT1664(ZEXT816(0) << 0x40);
                            fVar223 = (float)local_820._0_4_;
                            uVar206 = local_820._4_4_;
                            uVar239 = local_820._8_4_;
                            uVar240 = local_820._12_4_;
                            fVar222 = (float)local_840._0_4_;
                            uVar244 = local_840._4_4_;
                            uVar245 = local_840._8_4_;
                            uVar246 = local_840._12_4_;
                            if (*local_7d0.valid != 0) goto LAB_01bf7087;
LAB_01bf7137:
                            (ray->super_RayK<1>).tfar = auVar205._0_4_;
                          }
                        }
                      }
                    }
                  }
                }
              }
              bVar65 = lVar64 != 0;
              lVar64 = lVar64 + -1;
            } while ((!bVar10) && (bVar65));
            auVar57._4_4_ = fStack_4fc;
            auVar57._0_4_ = local_500;
            auVar57._8_4_ = fStack_4f8;
            auVar57._12_4_ = fStack_4f4;
            auVar57._16_4_ = fStack_4f0;
            auVar57._20_4_ = fStack_4ec;
            auVar57._24_4_ = fStack_4e8;
            auVar57._28_4_ = fStack_4e4;
            fVar222 = (ray->super_RayK<1>).tfar;
            auVar42._4_4_ = fVar222;
            auVar42._0_4_ = fVar222;
            auVar42._8_4_ = fVar222;
            auVar42._12_4_ = fVar222;
            auVar42._16_4_ = fVar222;
            auVar42._20_4_ = fVar222;
            auVar42._24_4_ = fVar222;
            auVar42._28_4_ = fVar222;
            uVar18 = vcmpps_avx512vl(auVar57,auVar42,2);
            bVar62 = ~('\x01' << ((byte)iVar21 & 0x1f)) & bVar62 & (byte)uVar18;
          } while (bVar62 != 0);
        }
        uVar19 = vpcmpd_avx512vl(local_480,_local_580,1);
        uVar20 = vpcmpd_avx512vl(local_480,local_3c0,1);
        auVar170._0_4_ = (float)local_700._0_4_ + (float)local_440._0_4_;
        auVar170._4_4_ = (float)local_700._4_4_ + (float)local_440._4_4_;
        auVar170._8_4_ = fStack_6f8 + fStack_438;
        auVar170._12_4_ = fStack_6f4 + fStack_434;
        auVar170._16_4_ = fStack_6f0 + fStack_430;
        auVar170._20_4_ = fStack_6ec + fStack_42c;
        auVar170._24_4_ = fStack_6e8 + fStack_428;
        auVar170._28_4_ = fStack_6e4 + fStack_424;
        fVar214 = (ray->super_RayK<1>).tfar;
        auVar190._4_4_ = fVar214;
        auVar190._0_4_ = fVar214;
        auVar190._8_4_ = fVar214;
        auVar190._12_4_ = fVar214;
        auVar190._16_4_ = fVar214;
        auVar190._20_4_ = fVar214;
        auVar190._24_4_ = fVar214;
        auVar190._28_4_ = fVar214;
        uVar18 = vcmpps_avx512vl(auVar170,auVar190,2);
        bVar62 = (byte)local_798 & (byte)uVar20 & (byte)uVar18;
        auVar194._0_4_ = (float)local_700._0_4_ + (float)local_400._0_4_;
        auVar194._4_4_ = (float)local_700._4_4_ + (float)local_400._4_4_;
        auVar194._8_4_ = fStack_6f8 + fStack_3f8;
        auVar194._12_4_ = fStack_6f4 + fStack_3f4;
        auVar194._16_4_ = fStack_6f0 + fStack_3f0;
        auVar194._20_4_ = fStack_6ec + fStack_3ec;
        auVar194._24_4_ = fStack_6e8 + fStack_3e8;
        auVar194._28_4_ = fStack_6e4 + fStack_3e4;
        uVar18 = vcmpps_avx512vl(auVar194,auVar190,2);
        bVar58 = bVar58 & (byte)uVar19 & (byte)uVar18 | bVar62;
        if (bVar58 == 0) {
          auVar243 = ZEXT3264(_DAT_02020f20);
        }
        else {
          uVar66 = local_7d8 & 0xffffffff;
          abStack_180[uVar66 * 0x60] = bVar58;
          auVar94._0_4_ =
               (uint)(bVar62 & 1) * local_440._0_4_ | (uint)!(bool)(bVar62 & 1) * local_400._0_4_;
          bVar10 = (bool)(bVar62 >> 1 & 1);
          auVar94._4_4_ = (uint)bVar10 * local_440._4_4_ | (uint)!bVar10 * local_400._4_4_;
          bVar10 = (bool)(bVar62 >> 2 & 1);
          auVar94._8_4_ = (uint)bVar10 * (int)fStack_438 | (uint)!bVar10 * (int)fStack_3f8;
          bVar10 = (bool)(bVar62 >> 3 & 1);
          auVar94._12_4_ = (uint)bVar10 * (int)fStack_434 | (uint)!bVar10 * (int)fStack_3f4;
          bVar10 = (bool)(bVar62 >> 4 & 1);
          auVar94._16_4_ = (uint)bVar10 * (int)fStack_430 | (uint)!bVar10 * (int)fStack_3f0;
          bVar10 = (bool)(bVar62 >> 5 & 1);
          auVar94._20_4_ = (uint)bVar10 * (int)fStack_42c | (uint)!bVar10 * (int)fStack_3ec;
          bVar10 = (bool)(bVar62 >> 6 & 1);
          auVar94._24_4_ = (uint)bVar10 * (int)fStack_428 | (uint)!bVar10 * (int)fStack_3e8;
          auVar94._28_4_ =
               (uint)(bVar62 >> 7) * (int)fStack_424 | (uint)!(bool)(bVar62 >> 7) * (int)fStack_3e4;
          *(undefined1 (*) [32])(auStack_160 + uVar66 * 0x60) = auVar94;
          uVar18 = vmovlps_avx(local_790);
          *(undefined8 *)(afStack_140 + uVar66 * 0x18) = uVar18;
          auStack_138[uVar66 * 0x18] = (int)local_748 + 1;
          local_7d8 = (ulong)((int)local_7d8 + 1);
          auVar243 = ZEXT3264(_DAT_02020f20);
        }
      }
    }
    auVar195 = ZEXT1664(local_790);
    fVar214 = (ray->super_RayK<1>).tfar;
    auVar141._4_4_ = fVar214;
    auVar141._0_4_ = fVar214;
    auVar141._8_4_ = fVar214;
    auVar141._12_4_ = fVar214;
    auVar141._16_4_ = fVar214;
    auVar141._20_4_ = fVar214;
    auVar141._24_4_ = fVar214;
    auVar141._28_4_ = fVar214;
    local_7d8 = local_7d8 & 0xffffffff;
    do {
      if ((int)local_7d8 == 0) {
        fVar214 = (ray->super_RayK<1>).tfar;
        auVar33._4_4_ = fVar214;
        auVar33._0_4_ = fVar214;
        auVar33._8_4_ = fVar214;
        auVar33._12_4_ = fVar214;
        uVar18 = vcmpps_avx512vl(local_490,auVar33,2);
        uVar67 = (uint)uVar18 & (uint)local_628 - 1 & (uint)local_628;
        uVar66 = (ulong)uVar67;
        if (uVar67 == 0) {
          return;
        }
        goto LAB_01bf4eb4;
      }
      uVar66 = (ulong)((int)local_7d8 - 1);
      lVar64 = uVar66 * 0x60;
      auVar83 = *(undefined1 (*) [32])(auStack_160 + lVar64);
      auVar85._0_4_ = (float)local_700._0_4_ + auVar83._0_4_;
      auVar85._4_4_ = (float)local_700._4_4_ + auVar83._4_4_;
      auVar85._8_4_ = fStack_6f8 + auVar83._8_4_;
      auVar85._12_4_ = fStack_6f4 + auVar83._12_4_;
      auVar85._16_4_ = fStack_6f0 + auVar83._16_4_;
      auVar85._20_4_ = fStack_6ec + auVar83._20_4_;
      auVar85._24_4_ = fStack_6e8 + auVar83._24_4_;
      auVar85._28_4_ = fStack_6e4 + auVar83._28_4_;
      uVar18 = vcmpps_avx512vl(auVar85,auVar141,2);
      uVar67 = (uint)uVar18 & (uint)abStack_180[lVar64];
      bVar58 = (byte)uVar67;
      if (uVar67 != 0) {
        auVar188._8_4_ = 0x7f800000;
        auVar188._0_8_ = 0x7f8000007f800000;
        auVar188._12_4_ = 0x7f800000;
        auVar188._16_4_ = 0x7f800000;
        auVar188._20_4_ = 0x7f800000;
        auVar188._24_4_ = 0x7f800000;
        auVar188._28_4_ = 0x7f800000;
        auVar84 = vblendmps_avx512vl(auVar188,auVar83);
        auVar94._0_4_ =
             (uint)(bVar58 & 1) * auVar84._0_4_ | (uint)!(bool)(bVar58 & 1) * (int)auVar83._0_4_;
        bVar10 = (bool)((byte)(uVar67 >> 1) & 1);
        auVar94._4_4_ = (uint)bVar10 * auVar84._4_4_ | (uint)!bVar10 * (int)auVar83._4_4_;
        bVar10 = (bool)((byte)(uVar67 >> 2) & 1);
        auVar94._8_4_ = (uint)bVar10 * auVar84._8_4_ | (uint)!bVar10 * (int)auVar83._8_4_;
        bVar10 = (bool)((byte)(uVar67 >> 3) & 1);
        auVar94._12_4_ = (uint)bVar10 * auVar84._12_4_ | (uint)!bVar10 * (int)auVar83._12_4_;
        bVar10 = (bool)((byte)(uVar67 >> 4) & 1);
        auVar94._16_4_ = (uint)bVar10 * auVar84._16_4_ | (uint)!bVar10 * (int)auVar83._16_4_;
        bVar10 = (bool)((byte)(uVar67 >> 5) & 1);
        auVar94._20_4_ = (uint)bVar10 * auVar84._20_4_ | (uint)!bVar10 * (int)auVar83._20_4_;
        bVar10 = (bool)((byte)(uVar67 >> 6) & 1);
        auVar94._24_4_ = (uint)bVar10 * auVar84._24_4_ | (uint)!bVar10 * (int)auVar83._24_4_;
        auVar94._28_4_ =
             (uVar67 >> 7) * auVar84._28_4_ | (uint)!SUB41(uVar67 >> 7,0) * (int)auVar83._28_4_;
        auVar83 = vshufps_avx(auVar94,auVar94,0xb1);
        auVar83 = vminps_avx(auVar94,auVar83);
        auVar84 = vshufpd_avx(auVar83,auVar83,5);
        auVar83 = vminps_avx(auVar83,auVar84);
        auVar84 = vpermpd_avx2(auVar83,0x4e);
        auVar83 = vminps_avx(auVar83,auVar84);
        uVar18 = vcmpps_avx512vl(auVar94,auVar83,0);
        bVar62 = (byte)uVar18 & bVar58;
        if (bVar62 != 0) {
          uVar67 = (uint)bVar62;
        }
        fVar214 = afStack_140[uVar66 * 0x18 + 1];
        uVar120 = 0;
        for (; (uVar67 & 1) == 0; uVar67 = uVar67 >> 1 | 0x80000000) {
          uVar120 = uVar120 + 1;
        }
        local_748 = (ulong)auStack_138[uVar66 * 0x18];
        bVar62 = ~('\x01' << ((byte)uVar120 & 0x1f)) & bVar58;
        abStack_180[lVar64] = bVar62;
        uVar60 = uVar66;
        if (bVar62 != 0) {
          uVar60 = local_7d8;
        }
        fVar222 = afStack_140[uVar66 * 0x18];
        auVar85._4_4_ = fVar222;
        auVar85._0_4_ = fVar222;
        auVar85._8_4_ = fVar222;
        auVar85._12_4_ = fVar222;
        auVar85._16_4_ = fVar222;
        auVar85._20_4_ = fVar222;
        auVar85._24_4_ = fVar222;
        auVar85._28_4_ = fVar222;
        fVar214 = fVar214 - fVar222;
        auVar169._4_4_ = fVar214;
        auVar169._0_4_ = fVar214;
        auVar169._8_4_ = fVar214;
        auVar169._12_4_ = fVar214;
        auVar169._16_4_ = fVar214;
        auVar169._20_4_ = fVar214;
        auVar169._24_4_ = fVar214;
        auVar169._28_4_ = fVar214;
        auVar76 = vfmadd132ps_fma(auVar169,auVar85,auVar243._0_32_);
        _local_440 = ZEXT1632(auVar76);
        auVar195 = ZEXT864(*(ulong *)(local_440 + (ulong)uVar120 * 4));
        uVar66 = uVar60;
      }
      local_7d8 = uVar66;
    } while (bVar58 == 0);
  } while( true );
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time());

          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }